

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  byte bVar36;
  uint uVar37;
  ulong uVar38;
  long lVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar74 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  int iVar110;
  float fVar111;
  undefined4 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  vfloat4 a0_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  vfloat4 a0_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar129;
  vfloat4 a0;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  vfloat4 b0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  __m128 a_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  __m128 a;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar164;
  float fVar172;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar192;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar191;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  vfloat4 a0_3;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar218;
  float fVar219;
  vfloat4 b0_2;
  undefined1 auVar210 [16];
  float fVar220;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  vfloat4 a0_4;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 in_ZMM18 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar39;
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  float fVar153;
  float fVar163;
  undefined1 auVar245 [32];
  
  PVar6 = prim[1];
  uVar38 = (ulong)(byte)PVar6;
  lVar40 = uVar38 * 0x25;
  fVar129 = *(float *)(prim + lVar40 + 0x12);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar70 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar71 = vsubps_avx(auVar50,*(undefined1 (*) [16])(prim + lVar40 + 6));
  fVar128 = fVar129 * auVar71._0_4_;
  fVar111 = fVar129 * auVar70._0_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar38 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar38 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar51);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar38 * 6 + 6);
  auVar82 = vpmovsxbd_avx2(auVar66);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar38 * 0xf + 6);
  auVar94 = vpmovsxbd_avx2(auVar62);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar88 = vpmovsxbd_avx2(auVar65);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar83 = vcvtdq2ps_avx(auVar88);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar38 + 6);
  auVar84 = vpmovsxbd_avx2(auVar67);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + uVar38 * 0x1a + 6);
  auVar85 = vpmovsxbd_avx2(auVar63);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar38 * 0x1b + 6);
  auVar86 = vpmovsxbd_avx2(auVar64);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar38 * 0x1c + 6);
  auVar79 = vpmovsxbd_avx2(auVar69);
  auVar87 = vcvtdq2ps_avx(auVar79);
  auVar96._4_4_ = fVar111;
  auVar96._0_4_ = fVar111;
  auVar96._8_4_ = fVar111;
  auVar96._12_4_ = fVar111;
  auVar96._16_4_ = fVar111;
  auVar96._20_4_ = fVar111;
  auVar96._24_4_ = fVar111;
  auVar96._28_4_ = fVar111;
  auVar253._8_4_ = 1;
  auVar253._0_8_ = 0x100000001;
  auVar253._12_4_ = 1;
  auVar253._16_4_ = 1;
  auVar253._20_4_ = 1;
  auVar253._24_4_ = 1;
  auVar253._28_4_ = 1;
  auVar77 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar90 = ZEXT1632(CONCAT412(fVar129 * auVar70._12_4_,
                               CONCAT48(fVar129 * auVar70._8_4_,
                                        CONCAT44(fVar129 * auVar70._4_4_,fVar111))));
  auVar89 = vpermps_avx2(auVar253,auVar90);
  auVar78 = vpermps_avx512vl(auVar77,auVar90);
  fVar223 = auVar78._0_4_;
  fVar209 = auVar78._4_4_;
  auVar90._4_4_ = fVar209 * auVar82._4_4_;
  auVar90._0_4_ = fVar223 * auVar82._0_4_;
  fVar218 = auVar78._8_4_;
  auVar90._8_4_ = fVar218 * auVar82._8_4_;
  fVar219 = auVar78._12_4_;
  auVar90._12_4_ = fVar219 * auVar82._12_4_;
  fVar118 = auVar78._16_4_;
  auVar90._16_4_ = fVar118 * auVar82._16_4_;
  fVar119 = auVar78._20_4_;
  auVar90._20_4_ = fVar119 * auVar82._20_4_;
  fVar120 = auVar78._24_4_;
  auVar90._24_4_ = fVar120 * auVar82._24_4_;
  auVar90._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar84._4_4_ * fVar209;
  auVar88._0_4_ = auVar84._0_4_ * fVar223;
  auVar88._8_4_ = auVar84._8_4_ * fVar218;
  auVar88._12_4_ = auVar84._12_4_ * fVar219;
  auVar88._16_4_ = auVar84._16_4_ * fVar118;
  auVar88._20_4_ = auVar84._20_4_ * fVar119;
  auVar88._24_4_ = auVar84._24_4_ * fVar120;
  auVar88._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar87._4_4_ * fVar209;
  auVar79._0_4_ = auVar87._0_4_ * fVar223;
  auVar79._8_4_ = auVar87._8_4_ * fVar218;
  auVar79._12_4_ = auVar87._12_4_ * fVar219;
  auVar79._16_4_ = auVar87._16_4_ * fVar118;
  auVar79._20_4_ = auVar87._20_4_ * fVar119;
  auVar79._24_4_ = auVar87._24_4_ * fVar120;
  auVar79._28_4_ = auVar78._28_4_;
  auVar50 = vfmadd231ps_fma(auVar90,auVar89,auVar80);
  auVar51 = vfmadd231ps_fma(auVar88,auVar89,auVar83);
  auVar66 = vfmadd231ps_fma(auVar79,auVar86,auVar89);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar96,auVar81);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar96,auVar94);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar85,auVar96);
  auVar244._4_4_ = fVar128;
  auVar244._0_4_ = fVar128;
  auVar244._8_4_ = fVar128;
  auVar244._12_4_ = fVar128;
  auVar244._16_4_ = fVar128;
  auVar244._20_4_ = fVar128;
  auVar244._24_4_ = fVar128;
  auVar244._28_4_ = fVar128;
  auVar79 = ZEXT1632(CONCAT412(fVar129 * auVar71._12_4_,
                               CONCAT48(fVar129 * auVar71._8_4_,
                                        CONCAT44(fVar129 * auVar71._4_4_,fVar128))));
  auVar88 = vpermps_avx2(auVar253,auVar79);
  auVar79 = vpermps_avx512vl(auVar77,auVar79);
  fVar129 = auVar79._0_4_;
  fVar223 = auVar79._4_4_;
  auVar89._4_4_ = fVar223 * auVar82._4_4_;
  auVar89._0_4_ = fVar129 * auVar82._0_4_;
  fVar209 = auVar79._8_4_;
  auVar89._8_4_ = fVar209 * auVar82._8_4_;
  fVar218 = auVar79._12_4_;
  auVar89._12_4_ = fVar218 * auVar82._12_4_;
  fVar219 = auVar79._16_4_;
  auVar89._16_4_ = fVar219 * auVar82._16_4_;
  fVar118 = auVar79._20_4_;
  auVar89._20_4_ = fVar118 * auVar82._20_4_;
  fVar119 = auVar79._24_4_;
  auVar89._24_4_ = fVar119 * auVar82._24_4_;
  auVar89._28_4_ = fVar111;
  auVar77._4_4_ = auVar84._4_4_ * fVar223;
  auVar77._0_4_ = auVar84._0_4_ * fVar129;
  auVar77._8_4_ = auVar84._8_4_ * fVar209;
  auVar77._12_4_ = auVar84._12_4_ * fVar218;
  auVar77._16_4_ = auVar84._16_4_ * fVar219;
  auVar77._20_4_ = auVar84._20_4_ * fVar118;
  auVar77._24_4_ = auVar84._24_4_ * fVar119;
  auVar77._28_4_ = auVar82._28_4_;
  auVar84._4_4_ = auVar87._4_4_ * fVar223;
  auVar84._0_4_ = auVar87._0_4_ * fVar129;
  auVar84._8_4_ = auVar87._8_4_ * fVar209;
  auVar84._12_4_ = auVar87._12_4_ * fVar218;
  auVar84._16_4_ = auVar87._16_4_ * fVar219;
  auVar84._20_4_ = auVar87._20_4_ * fVar118;
  auVar84._24_4_ = auVar87._24_4_ * fVar119;
  auVar84._28_4_ = auVar79._28_4_;
  auVar62 = vfmadd231ps_fma(auVar89,auVar88,auVar80);
  auVar65 = vfmadd231ps_fma(auVar77,auVar88,auVar83);
  auVar67 = vfmadd231ps_fma(auVar84,auVar88,auVar86);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar244,auVar81);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar244,auVar94);
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar244,auVar85);
  auVar81 = vandps_avx(ZEXT1632(auVar50),auVar97);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  uVar44 = vcmpps_avx512vl(auVar81,auVar188,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar78._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._12_4_;
  auVar78._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar78._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar78._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar78._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar51),auVar97);
  uVar44 = vcmpps_avx512vl(auVar81,auVar188,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar91._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar51._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar51._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar51._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar51._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar66),auVar97);
  uVar44 = vcmpps_avx512vl(auVar81,auVar188,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar81._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar66._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar66._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar66._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar66._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar149._8_4_ = 0x3f800000;
  auVar149._0_8_ = 0x3f8000003f800000;
  auVar149._12_4_ = 0x3f800000;
  auVar149._16_4_ = 0x3f800000;
  auVar149._20_4_ = 0x3f800000;
  auVar149._24_4_ = 0x3f800000;
  auVar149._28_4_ = 0x3f800000;
  auVar50 = vfnmadd213ps_fma(auVar78,auVar80,auVar149);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar91);
  auVar51 = vfnmadd213ps_fma(auVar91,auVar80,auVar149);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar81);
  auVar66 = vfnmadd213ps_fma(auVar81,auVar80,auVar149);
  auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar80,auVar80);
  fVar129 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar40 + 0x16)) *
            *(float *)(prim + lVar40 + 0x1a);
  auVar140._4_4_ = fVar129;
  auVar140._0_4_ = fVar129;
  auVar140._8_4_ = fVar129;
  auVar140._12_4_ = fVar129;
  auVar140._16_4_ = fVar129;
  auVar140._20_4_ = fVar129;
  auVar140._24_4_ = fVar129;
  auVar140._28_4_ = fVar129;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0xb + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 9 + 6));
  auVar62 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vcvtdq2ps_avx(auVar82);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0xd + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar65 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0x12 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar44 = (ulong)(uint)((int)(uVar38 * 5) << 2);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 2 + uVar44 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar67 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar44 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0x18 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar63 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0x1d + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 + (ulong)(byte)PVar6 * 0x20 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar64 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar6 * 0x20 - uVar38) + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0x23 + 6));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar69 = vfmadd213ps_fma(auVar80,auVar140,auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar70));
  auVar85._4_4_ = auVar50._4_4_ * auVar81._4_4_;
  auVar85._0_4_ = auVar50._0_4_ * auVar81._0_4_;
  auVar85._8_4_ = auVar50._8_4_ * auVar81._8_4_;
  auVar85._12_4_ = auVar50._12_4_ * auVar81._12_4_;
  auVar85._16_4_ = auVar81._16_4_ * 0.0;
  auVar85._20_4_ = auVar81._20_4_ * 0.0;
  auVar85._24_4_ = auVar81._24_4_ * 0.0;
  auVar85._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar70));
  auVar95._0_4_ = auVar50._0_4_ * auVar81._0_4_;
  auVar95._4_4_ = auVar50._4_4_ * auVar81._4_4_;
  auVar95._8_4_ = auVar50._8_4_ * auVar81._8_4_;
  auVar95._12_4_ = auVar50._12_4_ * auVar81._12_4_;
  auVar95._16_4_ = auVar81._16_4_ * 0.0;
  auVar95._20_4_ = auVar81._20_4_ * 0.0;
  auVar95._24_4_ = auVar81._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar81 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar71));
  auVar86._4_4_ = auVar51._4_4_ * auVar81._4_4_;
  auVar86._0_4_ = auVar51._0_4_ * auVar81._0_4_;
  auVar86._8_4_ = auVar51._8_4_ * auVar81._8_4_;
  auVar86._12_4_ = auVar51._12_4_ * auVar81._12_4_;
  auVar86._16_4_ = auVar81._16_4_ * 0.0;
  auVar86._20_4_ = auVar81._20_4_ * 0.0;
  auVar86._24_4_ = auVar81._24_4_ * 0.0;
  auVar86._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar71));
  auVar93._0_4_ = auVar51._0_4_ * auVar81._0_4_;
  auVar93._4_4_ = auVar51._4_4_ * auVar81._4_4_;
  auVar93._8_4_ = auVar51._8_4_ * auVar81._8_4_;
  auVar93._12_4_ = auVar51._12_4_ * auVar81._12_4_;
  auVar93._16_4_ = auVar81._16_4_ * 0.0;
  auVar93._20_4_ = auVar81._20_4_ * 0.0;
  auVar93._24_4_ = auVar81._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar81 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar113));
  auVar87._4_4_ = auVar66._4_4_ * auVar81._4_4_;
  auVar87._0_4_ = auVar66._0_4_ * auVar81._0_4_;
  auVar87._8_4_ = auVar66._8_4_ * auVar81._8_4_;
  auVar87._12_4_ = auVar66._12_4_ * auVar81._12_4_;
  auVar87._16_4_ = auVar81._16_4_ * 0.0;
  auVar87._20_4_ = auVar81._20_4_ * 0.0;
  auVar87._24_4_ = auVar81._24_4_ * 0.0;
  auVar87._28_4_ = auVar81._28_4_;
  auVar81 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar113));
  auVar92._0_4_ = auVar66._0_4_ * auVar81._0_4_;
  auVar92._4_4_ = auVar66._4_4_ * auVar81._4_4_;
  auVar92._8_4_ = auVar66._8_4_ * auVar81._8_4_;
  auVar92._12_4_ = auVar66._12_4_ * auVar81._12_4_;
  auVar92._16_4_ = auVar81._16_4_ * 0.0;
  auVar92._20_4_ = auVar81._20_4_ * 0.0;
  auVar92._24_4_ = auVar81._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar85,auVar95);
  auVar80 = vpminsd_avx2(auVar86,auVar93);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx2(auVar87,auVar92);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar82._4_4_ = uVar112;
  auVar82._0_4_ = uVar112;
  auVar82._8_4_ = uVar112;
  auVar82._12_4_ = uVar112;
  auVar82._16_4_ = uVar112;
  auVar82._20_4_ = uVar112;
  auVar82._24_4_ = uVar112;
  auVar82._28_4_ = uVar112;
  auVar80 = vmaxps_avx512vl(auVar80,auVar82);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar81,auVar80);
  auVar81 = vpmaxsd_avx2(auVar85,auVar95);
  auVar80 = vpmaxsd_avx2(auVar86,auVar93);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx2(auVar87,auVar92);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar112;
  auVar94._0_4_ = uVar112;
  auVar94._8_4_ = uVar112;
  auVar94._12_4_ = uVar112;
  auVar94._16_4_ = uVar112;
  auVar94._20_4_ = uVar112;
  auVar94._24_4_ = uVar112;
  auVar94._28_4_ = uVar112;
  auVar80 = vminps_avx512vl(auVar80,auVar94);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar83);
  auVar80 = vpbroadcastd_avx512vl();
  uVar19 = vpcmpgtd_avx512vl(auVar80,_DAT_01fe9900);
  uVar18 = vcmpps_avx512vl(local_1c0,auVar81,2);
  if ((byte)((byte)uVar18 & (byte)uVar19) == 0) {
    return;
  }
  uVar44 = (ulong)(byte)((byte)uVar18 & (byte)uVar19);
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar50 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar254 = ZEXT1664(auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar262 = ZEXT1664(auVar50);
LAB_01e224bb:
  lVar40 = 0;
  for (uVar38 = uVar44; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
    lVar40 = lVar40 + 1;
  }
  uVar45 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar45].ptr;
  fVar129 = (pGVar9->time_range).lower;
  fVar129 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar129) / ((pGVar9->time_range).upper - fVar129));
  auVar50 = vroundss_avx(ZEXT416((uint)fVar129),ZEXT416((uint)fVar129),9);
  uVar7 = *(uint *)(prim + lVar40 * 4 + 6);
  auVar51 = vaddss_avx512f(ZEXT416((uint)pGVar9->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar50 = vminss_avx(auVar50,auVar51);
  auVar52 = vmaxss_avx512f(auVar254._0_16_,auVar50);
  uVar38 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar7 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar42 = (long)(int)auVar52._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar42);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar42);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar38);
  lVar40 = uVar38 + 1;
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar40);
  lVar1 = uVar38 + 2;
  auVar66 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  lVar2 = uVar38 + 3;
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar42);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar42);
  auVar65 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar38);
  auVar67 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar40);
  auVar63 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar64 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar42);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar42);
  auVar69 = *(undefined1 (*) [16])(lVar12 + lVar13 * uVar38);
  auVar70 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar40);
  auVar71 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar1);
  auVar113 = *(undefined1 (*) [16])(lVar12 + lVar13 * lVar2);
  lVar12 = *(long *)(lVar11 + 0x38 + lVar42);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar42);
  auVar121 = *(undefined1 (*) [16])(lVar12 + uVar38 * lVar11);
  auVar72 = *(undefined1 (*) [16])(lVar12 + lVar40 * lVar11);
  auVar73 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar11);
  auVar53 = vsubss_avx512f(ZEXT416((uint)fVar129),auVar52);
  auVar74._0_12_ = ZEXT812(0);
  auVar74._12_4_ = 0;
  auVar52 = vmulps_avx512vl(auVar62,auVar74);
  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar55 = vfmadd213ps_avx512vl(auVar54,auVar66,auVar52);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar51,auVar56);
  auVar57 = vfmadd231ps_avx512vl(auVar55,auVar50,auVar54);
  auVar75 = auVar262._0_16_;
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar66,auVar75);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar51,auVar74);
  auVar58 = vfnmadd231ps_avx512vl(auVar52,auVar50,auVar75);
  auVar60._0_4_ = auVar64._0_4_ * 0.0;
  auVar60._4_4_ = auVar64._4_4_ * 0.0;
  auVar60._8_4_ = auVar64._8_4_ * 0.0;
  auVar60._12_4_ = auVar64._12_4_ * 0.0;
  auVar52 = vfmadd213ps_avx512vl(auVar54,auVar63,auVar60);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar56);
  auVar59 = vfmadd231ps_avx512vl(auVar52,auVar65,auVar54);
  auVar52 = vfmadd231ps_avx512vl(auVar60,auVar63,auVar75);
  auVar52 = vfnmadd231ps_fma(auVar52,auVar67,auVar74);
  auVar60 = vfnmadd231ps_avx512vl(auVar52,auVar65,auVar75);
  auVar52 = vmulps_avx512vl(auVar62,auVar54);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar66,auVar56);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar51,auVar54);
  auVar61 = vfmadd231ps_avx512vl(auVar52,auVar50,auVar74);
  auVar62 = vmulps_avx512vl(auVar62,auVar75);
  auVar66 = vfmadd231ps_fma(auVar62,auVar74,auVar66);
  auVar51 = vfnmadd231ps_avx512vl(auVar66,auVar75,auVar51);
  auVar55 = vfnmadd231ps_fma(auVar51,auVar74,auVar50);
  auVar50 = vmulps_avx512vl(auVar64,auVar54);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar63,auVar56);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar67,auVar54);
  auVar52 = vfmadd231ps_fma(auVar50,auVar65,auVar74);
  auVar50 = vmulps_avx512vl(auVar64,auVar75);
  auVar50 = vfmadd231ps_fma(auVar50,auVar74,auVar63);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar75,auVar67);
  auVar67 = vfnmadd231ps_fma(auVar50,auVar74,auVar65);
  auVar51 = vshufps_avx512vl(auVar58,auVar58,0xc9);
  auVar50 = vshufps_avx512vl(auVar59,auVar59,0xc9);
  auVar50 = vmulps_avx512vl(auVar58,auVar50);
  auVar50 = vfmsub231ps_avx512vl(auVar50,auVar51,auVar59);
  auVar66 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar50 = vmulps_avx512vl(auVar58,auVar50);
  auVar50 = vfmsub231ps_fma(auVar50,auVar51,auVar60);
  auVar62 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar51 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar76._0_4_ = auVar55._0_4_ * auVar51._0_4_;
  auVar76._4_4_ = auVar55._4_4_ * auVar51._4_4_;
  auVar76._8_4_ = auVar55._8_4_ * auVar51._8_4_;
  auVar76._12_4_ = auVar55._12_4_ * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar76,auVar50,auVar52);
  auVar65 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar154._0_4_ = auVar55._0_4_ * auVar51._0_4_;
  auVar154._4_4_ = auVar55._4_4_ * auVar51._4_4_;
  auVar154._8_4_ = auVar55._8_4_ * auVar51._8_4_;
  auVar154._12_4_ = auVar55._12_4_ * auVar51._12_4_;
  auVar50 = vfmsub231ps_fma(auVar154,auVar50,auVar67);
  auVar67 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vdpps_avx(auVar66,auVar66,0x7f);
  auVar51 = vrsqrt14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar63 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar50,ZEXT416(0xbf000000));
  auVar64 = vmulss_avx512f(auVar64,auVar51);
  auVar51 = vmulss_avx512f(auVar64,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  fVar129 = auVar63._0_4_ + auVar51._0_4_;
  auVar174._4_4_ = fVar129;
  auVar174._0_4_ = fVar129;
  auVar174._8_4_ = fVar129;
  auVar174._12_4_ = fVar129;
  auVar51 = vdpps_avx(auVar66,auVar62,0x7f);
  auVar63 = vmulps_avx512vl(auVar66,auVar174);
  auVar64 = vbroadcastss_avx512vl(auVar50);
  auVar62 = vmulps_avx512vl(auVar64,auVar62);
  fVar111 = auVar51._0_4_;
  auVar68._0_4_ = fVar111 * auVar66._0_4_;
  auVar68._4_4_ = fVar111 * auVar66._4_4_;
  auVar68._8_4_ = fVar111 * auVar66._8_4_;
  auVar68._12_4_ = fVar111 * auVar66._12_4_;
  auVar66 = vsubps_avx(auVar62,auVar68);
  auVar51 = vrcp14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar51,ZEXT416(0x40000000));
  fVar223 = auVar51._0_4_ * auVar50._0_4_;
  auVar50 = vdpps_avx(auVar65,auVar65,0x7f);
  auVar51 = vrsqrt14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar62 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar64 = vmulss_avx512f(auVar50,ZEXT416(0xbf000000));
  fVar111 = auVar51._0_4_;
  fVar111 = auVar62._0_4_ + auVar64._0_4_ * fVar111 * fVar111 * fVar111;
  auVar175._0_4_ = auVar65._0_4_ * fVar111;
  auVar175._4_4_ = auVar65._4_4_ * fVar111;
  auVar175._8_4_ = auVar65._8_4_ * fVar111;
  auVar175._12_4_ = auVar65._12_4_ * fVar111;
  auVar51 = vdpps_avx(auVar65,auVar67,0x7f);
  auVar62 = vbroadcastss_avx512vl(auVar50);
  auVar62 = vmulps_avx512vl(auVar62,auVar67);
  fVar209 = auVar51._0_4_;
  auVar52._0_4_ = fVar209 * auVar65._0_4_;
  auVar52._4_4_ = fVar209 * auVar65._4_4_;
  auVar52._8_4_ = fVar209 * auVar65._8_4_;
  auVar52._12_4_ = fVar209 * auVar65._12_4_;
  auVar51 = vsubps_avx(auVar62,auVar52);
  auVar62 = vrcp14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar62,ZEXT416(0x40000000));
  fVar209 = auVar62._0_4_ * auVar50._0_4_;
  auVar50 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar62 = vmulps_avx512vl(auVar50,auVar63);
  auVar64 = vsubps_avx512vl(auVar57,auVar62);
  auVar65 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar65 = vmulps_avx512vl(auVar65,auVar63);
  auVar59._0_4_ = auVar65._0_4_ + auVar50._0_4_ * fVar129 * fVar223 * auVar66._0_4_;
  auVar59._4_4_ = auVar65._4_4_ + auVar50._4_4_ * fVar129 * fVar223 * auVar66._4_4_;
  auVar59._8_4_ = auVar65._8_4_ + auVar50._8_4_ * fVar129 * fVar223 * auVar66._8_4_;
  auVar59._12_4_ = auVar65._12_4_ + auVar50._12_4_ * fVar129 * fVar223 * auVar66._12_4_;
  auVar66 = vsubps_avx512vl(auVar58,auVar59);
  auVar52 = vaddps_avx512vl(auVar57,auVar62);
  auVar62 = vaddps_avx512vl(auVar58,auVar59);
  auVar50 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar65 = vmulps_avx512vl(auVar50,auVar175);
  auVar57 = vsubps_avx512vl(auVar61,auVar65);
  auVar67 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar67 = vmulps_avx512vl(auVar67,auVar175);
  auVar176._0_4_ = auVar67._0_4_ + auVar50._0_4_ * fVar111 * auVar51._0_4_ * fVar209;
  auVar176._4_4_ = auVar67._4_4_ + auVar50._4_4_ * fVar111 * auVar51._4_4_ * fVar209;
  auVar176._8_4_ = auVar67._8_4_ + auVar50._8_4_ * fVar111 * auVar51._8_4_ * fVar209;
  auVar176._12_4_ = auVar67._12_4_ + auVar50._12_4_ * fVar111 * auVar51._12_4_ * fVar209;
  auVar50 = vsubps_avx(auVar55,auVar176);
  auVar58 = vaddps_avx512vl(auVar61,auVar65);
  auVar51 = vaddps_avx512vl(auVar55,auVar176);
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar66 = vmulps_avx512vl(auVar66,auVar55);
  auVar165._0_4_ = auVar64._0_4_ + auVar66._0_4_;
  auVar165._4_4_ = auVar64._4_4_ + auVar66._4_4_;
  auVar165._8_4_ = auVar64._8_4_ + auVar66._8_4_;
  auVar165._12_4_ = auVar64._12_4_ + auVar66._12_4_;
  auVar50 = vmulps_avx512vl(auVar50,auVar55);
  auVar63 = vsubps_avx(auVar57,auVar50);
  auVar50 = vmulps_avx512vl(auVar62,auVar55);
  local_4a0._4_4_ = auVar52._4_4_ + auVar50._4_4_;
  local_4a0._0_4_ = auVar52._0_4_ + auVar50._0_4_;
  fStack_498 = auVar52._8_4_ + auVar50._8_4_;
  fStack_494 = auVar52._12_4_ + auVar50._12_4_;
  auVar50 = vmulps_avx512vl(auVar51,auVar55);
  auVar59 = vsubps_avx512vl(auVar58,auVar50);
  auVar50 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  auVar51 = vmulps_avx512vl(auVar113,auVar74);
  auVar66 = vfmadd213ps_avx512vl(auVar54,auVar71,auVar51);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar70,auVar56);
  auVar60 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar75);
  auVar51 = vfnmadd231ps_fma(auVar51,auVar70,auVar74);
  auVar61 = vfnmadd231ps_avx512vl(auVar51,auVar69,auVar75);
  auVar51 = vmulps_avx512vl(auVar50,auVar74);
  auVar66 = vfmadd213ps_avx512vl(auVar54,auVar73,auVar51);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar72,auVar56);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar121,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar73,auVar75);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar72,auVar74);
  auVar62 = vfnmadd231ps_avx512vl(auVar51,auVar121,auVar75);
  auVar51 = vmulps_avx512vl(auVar113,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar56);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar70,auVar54);
  auVar68 = vfmadd231ps_avx512vl(auVar51,auVar69,auVar74);
  auVar51 = vmulps_avx512vl(auVar113,auVar75);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar74,auVar71);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar75,auVar70);
  auVar69 = vfnmadd231ps_avx512vl(auVar51,auVar74,auVar69);
  auVar51 = vmulps_avx512vl(auVar50,auVar54);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar73,auVar56);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar72,auVar54);
  auVar51 = vfmadd231ps_fma(auVar51,auVar121,auVar74);
  auVar50 = vmulps_avx512vl(auVar50,auVar75);
  auVar50 = vfmadd231ps_fma(auVar50,auVar74,auVar73);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar75,auVar72);
  auVar67 = vfnmadd231ps_fma(auVar50,auVar74,auVar121);
  auVar50 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar65 = vshufps_avx512vl(auVar66,auVar66,0xc9);
  fVar209 = auVar61._0_4_;
  auVar224._0_4_ = fVar209 * auVar65._0_4_;
  fVar218 = auVar61._4_4_;
  auVar224._4_4_ = fVar218 * auVar65._4_4_;
  fVar219 = auVar61._8_4_;
  auVar224._8_4_ = fVar219 * auVar65._8_4_;
  fVar118 = auVar61._12_4_;
  auVar224._12_4_ = fVar118 * auVar65._12_4_;
  auVar66 = vfmsub231ps_avx512vl(auVar224,auVar50,auVar66);
  auVar66 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar65 = vshufps_avx512vl(auVar62,auVar62,0xc9);
  auVar234._0_4_ = fVar209 * auVar65._0_4_;
  auVar234._4_4_ = fVar218 * auVar65._4_4_;
  auVar234._8_4_ = fVar219 * auVar65._8_4_;
  auVar234._12_4_ = fVar118 * auVar65._12_4_;
  auVar50 = vfmsub231ps_avx512vl(auVar234,auVar50,auVar62);
  auVar62 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar70 = vshufps_avx512vl(auVar69,auVar69,0xc9);
  auVar50 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar50 = vmulps_avx512vl(auVar69,auVar50);
  auVar50 = vfmsub231ps_fma(auVar50,auVar70,auVar51);
  auVar65 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar51 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar50 = vdpps_avx(auVar66,auVar66,0x7f);
  auVar51 = vmulps_avx512vl(auVar69,auVar51);
  auVar51 = vfmsub231ps_fma(auVar51,auVar70,auVar67);
  auVar67 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vrsqrt14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar70 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar71 = vmulss_avx512f(auVar50,ZEXT416(0xbf000000));
  auVar71 = vmulss_avx512f(auVar71,auVar51);
  auVar51 = vmulss_avx512f(auVar71,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  auVar51 = vaddss_avx512f(auVar70,auVar51);
  auVar246._0_4_ = auVar51._0_4_;
  auVar246._4_4_ = auVar246._0_4_;
  auVar246._8_4_ = auVar246._0_4_;
  auVar246._12_4_ = auVar246._0_4_;
  auVar70 = vmulps_avx512vl(auVar66,auVar246);
  auVar51 = vdpps_avx(auVar66,auVar62,0x7f);
  auVar71 = vbroadcastss_avx512vl(auVar50);
  auVar62 = vmulps_avx512vl(auVar71,auVar62);
  fVar129 = auVar51._0_4_;
  auVar72._0_4_ = auVar66._0_4_ * fVar129;
  auVar72._4_4_ = auVar66._4_4_ * fVar129;
  auVar72._8_4_ = auVar66._8_4_ * fVar129;
  auVar72._12_4_ = auVar66._12_4_ * fVar129;
  auVar66 = vsubps_avx(auVar62,auVar72);
  auVar51 = vrcp14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar51,ZEXT416(0x40000000));
  fVar111 = auVar51._0_4_ * auVar50._0_4_;
  auVar50 = vdpps_avx(auVar65,auVar65,0x7f);
  auVar51 = vrsqrt14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar62 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar71 = vmulss_avx512f(auVar50,ZEXT416(0xbf000000));
  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar129 = auVar51._0_4_;
  fVar129 = auVar62._0_4_ + auVar71._0_4_ * fVar129 * fVar129 * fVar129;
  auVar240._0_4_ = auVar65._0_4_ * fVar129;
  auVar240._4_4_ = auVar65._4_4_ * fVar129;
  auVar240._8_4_ = auVar65._8_4_ * fVar129;
  auVar240._12_4_ = auVar65._12_4_ * fVar129;
  auVar51 = vdpps_avx(auVar65,auVar67,0x7f);
  auVar62 = vbroadcastss_avx512vl(auVar50);
  auVar62 = vmulps_avx512vl(auVar62,auVar67);
  fVar223 = auVar51._0_4_;
  auVar201._0_4_ = fVar223 * auVar65._0_4_;
  auVar201._4_4_ = fVar223 * auVar65._4_4_;
  auVar201._8_4_ = fVar223 * auVar65._8_4_;
  auVar201._12_4_ = fVar223 * auVar65._12_4_;
  auVar51 = vsubps_avx(auVar62,auVar201);
  auVar62 = vrcp14ss_avx512f(auVar74,ZEXT416(auVar50._0_4_));
  auVar50 = vfnmadd213ss_avx512f(auVar50,auVar62,ZEXT416(0x40000000));
  auVar259 = ZEXT464(0x3f800000);
  fVar223 = auVar50._0_4_ * auVar62._0_4_;
  auVar62 = vshufps_avx512vl(auVar60,auVar60,0xff);
  auVar65 = vmulps_avx512vl(auVar62,auVar70);
  auVar67 = vsubps_avx512vl(auVar60,auVar65);
  auVar50 = vshufps_avx(auVar61,auVar61,0xff);
  auVar50 = vmulps_avx512vl(auVar50,auVar70);
  auVar56._0_4_ = auVar50._0_4_ + auVar62._0_4_ * auVar246._0_4_ * fVar111 * auVar66._0_4_;
  auVar56._4_4_ = auVar50._4_4_ + auVar62._4_4_ * auVar246._0_4_ * fVar111 * auVar66._4_4_;
  auVar56._8_4_ = auVar50._8_4_ + auVar62._8_4_ * auVar246._0_4_ * fVar111 * auVar66._8_4_;
  auVar56._12_4_ = auVar50._12_4_ + auVar62._12_4_ * auVar246._0_4_ * fVar111 * auVar66._12_4_;
  auVar50 = vsubps_avx(auVar61,auVar56);
  auVar66 = vaddps_avx512vl(auVar60,auVar65);
  auVar61._0_4_ = fVar209 + auVar56._0_4_;
  auVar61._4_4_ = fVar218 + auVar56._4_4_;
  auVar61._8_4_ = fVar219 + auVar56._8_4_;
  auVar61._12_4_ = fVar118 + auVar56._12_4_;
  auVar62 = vshufps_avx512vl(auVar68,auVar68,0xff);
  auVar235._0_4_ = auVar62._0_4_ * auVar240._0_4_;
  auVar235._4_4_ = auVar62._4_4_ * auVar240._4_4_;
  auVar235._8_4_ = auVar62._8_4_ * auVar240._8_4_;
  auVar235._12_4_ = auVar62._12_4_ * auVar240._12_4_;
  auVar65 = vsubps_avx512vl(auVar68,auVar235);
  auVar70 = vshufps_avx512vl(auVar69,auVar69,0xff);
  auVar70 = vmulps_avx512vl(auVar70,auVar240);
  auVar155._0_4_ = auVar70._0_4_ + auVar62._0_4_ * fVar129 * auVar51._0_4_ * fVar223;
  auVar155._4_4_ = auVar70._4_4_ + auVar62._4_4_ * fVar129 * auVar51._4_4_ * fVar223;
  auVar155._8_4_ = auVar70._8_4_ + auVar62._8_4_ * fVar129 * auVar51._8_4_ * fVar223;
  auVar155._12_4_ = auVar70._12_4_ + auVar62._12_4_ * fVar129 * auVar51._12_4_ * fVar223;
  auVar51 = vsubps_avx512vl(auVar69,auVar155);
  auVar62 = vaddps_avx512vl(auVar68,auVar235);
  auVar69 = vaddps_avx512vl(auVar69,auVar155);
  auVar50 = vmulps_avx512vl(auVar50,auVar55);
  auVar202._0_4_ = auVar67._0_4_ + auVar50._0_4_;
  auVar202._4_4_ = auVar67._4_4_ + auVar50._4_4_;
  auVar202._8_4_ = auVar67._8_4_ + auVar50._8_4_;
  auVar202._12_4_ = auVar67._12_4_ + auVar50._12_4_;
  auVar50 = vmulps_avx512vl(auVar51,auVar55);
  auVar50 = vsubps_avx(auVar65,auVar50);
  auVar51 = vmulps_avx512vl(auVar61,auVar55);
  auVar75._0_4_ = auVar66._0_4_ + auVar51._0_4_;
  auVar75._4_4_ = auVar66._4_4_ + auVar51._4_4_;
  auVar75._8_4_ = auVar66._8_4_ + auVar51._8_4_;
  auVar75._12_4_ = auVar66._12_4_ + auVar51._12_4_;
  auVar51 = vmulps_avx512vl(auVar69,auVar55);
  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar260 = ZEXT1664(auVar70);
  auVar51 = vsubps_avx(auVar62,auVar51);
  auVar69 = vbroadcastss_avx512vl(auVar53);
  auVar71 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
  auVar113._0_4_ = auVar71._0_4_;
  auVar113._4_4_ = auVar113._0_4_;
  auVar113._8_4_ = auVar113._0_4_;
  auVar113._12_4_ = auVar113._0_4_;
  auVar67 = vmulps_avx512vl(auVar69,auVar67);
  auVar71 = vmulps_avx512vl(auVar69,auVar202);
  auVar50 = vmulps_avx512vl(auVar69,auVar50);
  auVar247._0_4_ = auVar69._0_4_ * auVar65._0_4_;
  auVar247._4_4_ = auVar69._4_4_ * auVar65._4_4_;
  auVar247._8_4_ = auVar69._8_4_ * auVar65._8_4_;
  auVar247._12_4_ = auVar69._12_4_ * auVar65._12_4_;
  local_350 = vfmadd231ps_avx512vl(auVar67,auVar113,auVar64);
  local_360 = vfmadd231ps_avx512vl(auVar71,auVar113,auVar165);
  local_370 = vfmadd231ps_avx512vl(auVar50,auVar113,auVar63);
  local_380 = vfmadd231ps_fma(auVar247,auVar113,auVar57);
  auVar50 = vmulps_avx512vl(auVar69,auVar66);
  auVar66 = vmulps_avx512vl(auVar69,auVar75);
  auVar51 = vmulps_avx512vl(auVar69,auVar51);
  auVar236._0_4_ = auVar69._0_4_ * auVar62._0_4_;
  auVar236._4_4_ = auVar69._4_4_ * auVar62._4_4_;
  auVar236._8_4_ = auVar69._8_4_ * auVar62._8_4_;
  auVar236._12_4_ = auVar69._12_4_ * auVar62._12_4_;
  _local_390 = vfmadd231ps_avx512vl(auVar50,auVar113,auVar52);
  _local_3a0 = vfmadd231ps_avx512vl(auVar66,auVar113,_local_4a0);
  _local_3b0 = vfmadd231ps_avx512vl(auVar51,auVar113,auVar59);
  _local_3c0 = vfmadd231ps_fma(auVar236,auVar113,auVar58);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar129 = *(float *)(ray + k * 4 + 0x60);
  local_2d0 = vsubps_avx512vl(local_350,auVar50);
  uVar112 = local_2d0._0_4_;
  auVar121._4_4_ = uVar112;
  auVar121._0_4_ = uVar112;
  auVar121._8_4_ = uVar112;
  auVar121._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar66 = vshufps_avx(local_2d0,local_2d0,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar111 = pre->ray_space[k].vz.field_0.m128[0];
  fVar223 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar218 = pre->ray_space[k].vz.field_0.m128[3];
  auVar71._0_4_ = fVar111 * auVar66._0_4_;
  auVar71._4_4_ = fVar223 * auVar66._4_4_;
  auVar71._8_4_ = fVar209 * auVar66._8_4_;
  auVar71._12_4_ = fVar218 * auVar66._12_4_;
  auVar51 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar5,auVar51);
  auVar65 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar121);
  local_2e0 = vsubps_avx512vl(local_360,auVar50);
  uVar112 = local_2e0._0_4_;
  auVar55._4_4_ = uVar112;
  auVar55._0_4_ = uVar112;
  auVar55._8_4_ = uVar112;
  auVar55._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar66 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar73._0_4_ = fVar111 * auVar66._0_4_;
  auVar73._4_4_ = fVar223 * auVar66._4_4_;
  auVar73._8_4_ = fVar209 * auVar66._8_4_;
  auVar73._12_4_ = fVar218 * auVar66._12_4_;
  auVar51 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar5,auVar51);
  auVar67 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar55);
  local_2f0 = vsubps_avx512vl(local_370,auVar50);
  uVar112 = local_2f0._0_4_;
  auVar57._4_4_ = uVar112;
  auVar57._0_4_ = uVar112;
  auVar57._8_4_ = uVar112;
  auVar57._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar66 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar53._0_4_ = fVar111 * auVar66._0_4_;
  auVar53._4_4_ = fVar223 * auVar66._4_4_;
  auVar53._8_4_ = fVar209 * auVar66._8_4_;
  auVar53._12_4_ = fVar218 * auVar66._12_4_;
  auVar51 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar5,auVar51);
  auVar63 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar57);
  local_300 = vsubps_avx(local_380,auVar50);
  uVar112 = local_300._0_4_;
  auVar177._4_4_ = uVar112;
  auVar177._0_4_ = uVar112;
  auVar177._8_4_ = uVar112;
  auVar177._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_300,local_300,0x55);
  auVar66 = vshufps_avx(local_300,local_300,0xaa);
  auVar58._0_4_ = fVar111 * auVar66._0_4_;
  auVar58._4_4_ = fVar223 * auVar66._4_4_;
  auVar58._8_4_ = fVar209 * auVar66._8_4_;
  auVar58._12_4_ = fVar218 * auVar66._12_4_;
  auVar51 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar5,auVar51);
  auVar64 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar177);
  local_310 = vsubps_avx512vl(_local_390,auVar50);
  uVar112 = local_310._0_4_;
  auVar178._4_4_ = uVar112;
  auVar178._0_4_ = uVar112;
  auVar178._8_4_ = uVar112;
  auVar178._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_310,local_310,0x55);
  auVar66 = vshufps_avx(local_310,local_310,0xaa);
  auVar203._0_4_ = auVar66._0_4_ * fVar111;
  auVar203._4_4_ = auVar66._4_4_ * fVar223;
  auVar203._8_4_ = auVar66._8_4_ * fVar209;
  auVar203._12_4_ = auVar66._12_4_ * fVar218;
  auVar51 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar5,auVar51);
  auVar69 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar178);
  local_320 = vsubps_avx512vl(_local_3a0,auVar50);
  uVar112 = local_320._0_4_;
  auVar179._4_4_ = uVar112;
  auVar179._0_4_ = uVar112;
  auVar179._8_4_ = uVar112;
  auVar179._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_320,local_320,0x55);
  auVar66 = vshufps_avx(local_320,local_320,0xaa);
  auVar210._0_4_ = auVar66._0_4_ * fVar111;
  auVar210._4_4_ = auVar66._4_4_ * fVar223;
  auVar210._8_4_ = auVar66._8_4_ * fVar209;
  auVar210._12_4_ = auVar66._12_4_ * fVar218;
  auVar51 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar5,auVar51);
  auVar71 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar179);
  local_330 = vsubps_avx512vl(_local_3b0,auVar50);
  uVar112 = local_330._0_4_;
  auVar180._4_4_ = uVar112;
  auVar180._0_4_ = uVar112;
  auVar180._8_4_ = uVar112;
  auVar180._12_4_ = uVar112;
  auVar51 = vshufps_avx(local_330,local_330,0x55);
  auVar66 = vshufps_avx(local_330,local_330,0xaa);
  auVar225._0_4_ = auVar66._0_4_ * fVar111;
  auVar225._4_4_ = auVar66._4_4_ * fVar223;
  auVar225._8_4_ = auVar66._8_4_ * fVar209;
  auVar225._12_4_ = auVar66._12_4_ * fVar218;
  auVar51 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar51);
  auVar113 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar180);
  local_340 = vsubps_avx(_local_3c0,auVar50);
  uVar112 = local_340._0_4_;
  auVar54._4_4_ = uVar112;
  auVar54._0_4_ = uVar112;
  auVar54._8_4_ = uVar112;
  auVar54._12_4_ = uVar112;
  auVar50 = vshufps_avx(local_340,local_340,0x55);
  auVar51 = vshufps_avx(local_340,local_340,0xaa);
  auVar166._0_4_ = auVar51._0_4_ * fVar111;
  auVar166._4_4_ = auVar51._4_4_ * fVar223;
  auVar166._8_4_ = auVar51._8_4_ * fVar209;
  auVar166._12_4_ = auVar51._12_4_ * fVar218;
  auVar50 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar50);
  auVar121 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar4,auVar54);
  auVar66 = vmovlhps_avx(auVar65,auVar69);
  local_440 = vmovlhps_avx(auVar67,auVar71);
  local_450 = vmovlhps_avx(auVar63,auVar113);
  _local_290 = vmovlhps_avx512f(auVar64,auVar121);
  auVar51 = vminps_avx(auVar66,local_440);
  auVar50 = vmaxps_avx(auVar66,local_440);
  auVar62 = vminps_avx512vl(local_450,_local_290);
  auVar51 = vminps_avx(auVar51,auVar62);
  auVar62 = vmaxps_avx512vl(local_450,_local_290);
  auVar50 = vmaxps_avx(auVar50,auVar62);
  auVar62 = vshufpd_avx(auVar51,auVar51,3);
  auVar51 = vminps_avx(auVar51,auVar62);
  auVar62 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vmaxps_avx(auVar50,auVar62);
  auVar51 = vandps_avx512vl(auVar51,auVar70);
  auVar50 = vandps_avx512vl(auVar50,auVar70);
  auVar50 = vmaxps_avx(auVar51,auVar50);
  auVar51 = vmovshdup_avx(auVar50);
  auVar50 = vmaxss_avx(auVar51,auVar50);
  fVar111 = auVar50._0_4_ * 9.536743e-07;
  auVar51 = vmovddup_avx512vl(auVar65);
  auVar62 = vmovddup_avx512vl(auVar67);
  auVar65 = vmovddup_avx512vl(auVar63);
  auVar67 = vmovddup_avx512vl(auVar64);
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar111));
  auVar50 = vxorps_avx512vl(local_260._0_16_,auVar72);
  local_280 = vbroadcastss_avx512vl(auVar50);
  uVar38 = 0;
  local_2a0 = vsubps_avx(local_440,auVar66);
  local_2b0 = vsubps_avx(local_450,local_440);
  local_2c0 = vsubps_avx512vl(_local_290,local_450);
  local_3d0 = vsubps_avx512vl(_local_390,local_350);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_360);
  local_3f0 = vsubps_avx512vl(_local_3b0,local_370);
  _local_400 = vsubps_avx(_local_3c0,local_380);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar50 = ZEXT816(0x3f80000000000000);
  auVar70 = auVar50;
LAB_01e23009:
  do {
    auVar63 = vshufps_avx(auVar70,auVar70,0x50);
    auVar241._8_4_ = 0x3f800000;
    auVar241._0_8_ = 0x3f8000003f800000;
    auVar241._12_4_ = 0x3f800000;
    auVar245._16_4_ = 0x3f800000;
    auVar245._0_16_ = auVar241;
    auVar245._20_4_ = 0x3f800000;
    auVar245._24_4_ = 0x3f800000;
    auVar245._28_4_ = 0x3f800000;
    auVar64 = vsubps_avx(auVar241,auVar63);
    fVar223 = auVar63._0_4_;
    fVar118 = auVar69._0_4_;
    auVar137._0_4_ = fVar118 * fVar223;
    fVar209 = auVar63._4_4_;
    fVar119 = auVar69._4_4_;
    auVar137._4_4_ = fVar119 * fVar209;
    fVar218 = auVar63._8_4_;
    auVar137._8_4_ = fVar118 * fVar218;
    fVar219 = auVar63._12_4_;
    auVar137._12_4_ = fVar119 * fVar219;
    fVar120 = auVar71._0_4_;
    auVar143._0_4_ = fVar120 * fVar223;
    fVar128 = auVar71._4_4_;
    auVar143._4_4_ = fVar128 * fVar209;
    auVar143._8_4_ = fVar120 * fVar218;
    auVar143._12_4_ = fVar128 * fVar219;
    fVar153 = auVar113._0_4_;
    auVar156._0_4_ = fVar153 * fVar223;
    fVar163 = auVar113._4_4_;
    auVar156._4_4_ = fVar163 * fVar209;
    auVar156._8_4_ = fVar153 * fVar218;
    auVar156._12_4_ = fVar163 * fVar219;
    fVar164 = auVar121._0_4_;
    auVar123._0_4_ = fVar164 * fVar223;
    fVar172 = auVar121._4_4_;
    auVar123._4_4_ = fVar172 * fVar209;
    auVar123._8_4_ = fVar164 * fVar218;
    auVar123._12_4_ = fVar172 * fVar219;
    auVar72 = vfmadd231ps_avx512vl(auVar137,auVar64,auVar51);
    auVar73 = vfmadd231ps_avx512vl(auVar143,auVar64,auVar62);
    auVar52 = vfmadd231ps_avx512vl(auVar156,auVar64,auVar65);
    auVar64 = vfmadd231ps_avx512vl(auVar123,auVar67,auVar64);
    auVar63 = vmovshdup_avx(auVar50);
    fVar209 = auVar50._0_4_;
    fVar223 = (auVar63._0_4_ - fVar209) * 0.04761905;
    auVar189._4_4_ = fVar209;
    auVar189._0_4_ = fVar209;
    auVar189._8_4_ = fVar209;
    auVar189._12_4_ = fVar209;
    auVar189._16_4_ = fVar209;
    auVar189._20_4_ = fVar209;
    auVar189._24_4_ = fVar209;
    auVar189._28_4_ = fVar209;
    auVar135._0_8_ = auVar63._0_8_;
    auVar135._8_8_ = auVar135._0_8_;
    auVar135._16_8_ = auVar135._0_8_;
    auVar135._24_8_ = auVar135._0_8_;
    auVar81 = vsubps_avx(auVar135,auVar189);
    uVar112 = auVar72._0_4_;
    auVar136._4_4_ = uVar112;
    auVar136._0_4_ = uVar112;
    auVar136._8_4_ = uVar112;
    auVar136._12_4_ = uVar112;
    auVar136._16_4_ = uVar112;
    auVar136._20_4_ = uVar112;
    auVar136._24_4_ = uVar112;
    auVar136._28_4_ = uVar112;
    auVar206._8_4_ = 1;
    auVar206._0_8_ = 0x100000001;
    auVar206._12_4_ = 1;
    auVar206._16_4_ = 1;
    auVar206._20_4_ = 1;
    auVar206._24_4_ = 1;
    auVar206._28_4_ = 1;
    auVar94 = ZEXT1632(auVar72);
    auVar80 = vpermps_avx2(auVar206,auVar94);
    auVar82 = vbroadcastss_avx512vl(auVar73);
    auVar77 = ZEXT1632(auVar73);
    auVar83 = vpermps_avx512vl(auVar206,auVar77);
    auVar84 = vbroadcastss_avx512vl(auVar52);
    auVar78 = ZEXT1632(auVar52);
    auVar85 = vpermps_avx512vl(auVar206,auVar78);
    auVar86 = vbroadcastss_avx512vl(auVar64);
    auVar92 = ZEXT1632(auVar64);
    auVar87 = vpermps_avx512vl(auVar206,auVar92);
    auVar207._4_4_ = fVar223;
    auVar207._0_4_ = fVar223;
    auVar207._8_4_ = fVar223;
    auVar207._12_4_ = fVar223;
    auVar207._16_4_ = fVar223;
    auVar207._20_4_ = fVar223;
    auVar207._24_4_ = fVar223;
    auVar207._28_4_ = fVar223;
    auVar171._8_4_ = 2;
    auVar171._0_8_ = 0x200000002;
    auVar171._12_4_ = 2;
    auVar171._16_4_ = 2;
    auVar171._20_4_ = 2;
    auVar171._24_4_ = 2;
    auVar171._28_4_ = 2;
    auVar88 = vpermps_avx512vl(auVar171,auVar94);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar89 = vpermps_avx512vl(auVar79,auVar94);
    auVar90 = vpermps_avx512vl(auVar171,auVar77);
    auVar77 = vpermps_avx512vl(auVar79,auVar77);
    auVar94 = vpermps_avx2(auVar171,auVar78);
    auVar78 = vpermps_avx512vl(auVar79,auVar78);
    auVar91 = vpermps_avx512vl(auVar171,auVar92);
    auVar79 = vpermps_avx512vl(auVar79,auVar92);
    auVar63 = vfmadd132ps_fma(auVar81,auVar189,_DAT_01faff20);
    auVar81 = vsubps_avx(auVar245,ZEXT1632(auVar63));
    auVar92 = vmulps_avx512vl(auVar82,ZEXT1632(auVar63));
    auVar95 = ZEXT1632(auVar63);
    auVar93 = vmulps_avx512vl(auVar83,auVar95);
    auVar64 = vfmadd231ps_fma(auVar92,auVar81,auVar136);
    auVar72 = vfmadd231ps_fma(auVar93,auVar81,auVar80);
    auVar92 = vmulps_avx512vl(auVar84,auVar95);
    auVar93 = vmulps_avx512vl(auVar85,auVar95);
    auVar82 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar93,auVar81,auVar83);
    auVar92 = vmulps_avx512vl(auVar86,auVar95);
    auVar93 = ZEXT1632(auVar63);
    auVar87 = vmulps_avx512vl(auVar87,auVar93);
    auVar84 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar87,auVar81,auVar85);
    fVar218 = auVar63._0_4_;
    fVar219 = auVar63._4_4_;
    auVar24._4_4_ = fVar219 * auVar82._4_4_;
    auVar24._0_4_ = fVar218 * auVar82._0_4_;
    fVar220 = auVar63._8_4_;
    auVar24._8_4_ = fVar220 * auVar82._8_4_;
    fVar221 = auVar63._12_4_;
    auVar24._12_4_ = fVar221 * auVar82._12_4_;
    auVar24._16_4_ = auVar82._16_4_ * 0.0;
    auVar24._20_4_ = auVar82._20_4_ * 0.0;
    auVar24._24_4_ = auVar82._24_4_ * 0.0;
    auVar24._28_4_ = fVar209;
    auVar25._4_4_ = fVar219 * auVar83._4_4_;
    auVar25._0_4_ = fVar218 * auVar83._0_4_;
    auVar25._8_4_ = fVar220 * auVar83._8_4_;
    auVar25._12_4_ = fVar221 * auVar83._12_4_;
    auVar25._16_4_ = auVar83._16_4_ * 0.0;
    auVar25._20_4_ = auVar83._20_4_ * 0.0;
    auVar25._24_4_ = auVar83._24_4_ * 0.0;
    auVar25._28_4_ = auVar80._28_4_;
    auVar64 = vfmadd231ps_fma(auVar24,auVar81,ZEXT1632(auVar64));
    auVar72 = vfmadd231ps_fma(auVar25,auVar81,ZEXT1632(auVar72));
    auVar126._0_4_ = fVar218 * auVar84._0_4_;
    auVar126._4_4_ = fVar219 * auVar84._4_4_;
    auVar126._8_4_ = fVar220 * auVar84._8_4_;
    auVar126._12_4_ = fVar221 * auVar84._12_4_;
    auVar126._16_4_ = auVar84._16_4_ * 0.0;
    auVar126._20_4_ = auVar84._20_4_ * 0.0;
    auVar126._24_4_ = auVar84._24_4_ * 0.0;
    auVar126._28_4_ = 0;
    auVar26._4_4_ = fVar219 * auVar85._4_4_;
    auVar26._0_4_ = fVar218 * auVar85._0_4_;
    auVar26._8_4_ = fVar220 * auVar85._8_4_;
    auVar26._12_4_ = fVar221 * auVar85._12_4_;
    auVar26._16_4_ = auVar85._16_4_ * 0.0;
    auVar26._20_4_ = auVar85._20_4_ * 0.0;
    auVar26._24_4_ = auVar85._24_4_ * 0.0;
    auVar26._28_4_ = auVar84._28_4_;
    auVar73 = vfmadd231ps_fma(auVar126,auVar81,auVar82);
    auVar52 = vfmadd231ps_fma(auVar26,auVar81,auVar83);
    auVar27._28_4_ = auVar83._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * auVar52._12_4_,
                            CONCAT48(fVar220 * auVar52._8_4_,
                                     CONCAT44(fVar219 * auVar52._4_4_,fVar218 * auVar52._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar221 * auVar73._12_4_,
                                                 CONCAT48(fVar220 * auVar73._8_4_,
                                                          CONCAT44(fVar219 * auVar73._4_4_,
                                                                   fVar218 * auVar73._0_4_)))),
                              auVar81,ZEXT1632(auVar64));
    auVar53 = vfmadd231ps_fma(auVar27,auVar81,ZEXT1632(auVar72));
    auVar80 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar64));
    auVar82 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar72));
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar80 = vmulps_avx512vl(auVar80,auVar83);
    auVar82 = vmulps_avx512vl(auVar82,auVar83);
    auVar200._0_4_ = fVar223 * auVar80._0_4_;
    auVar200._4_4_ = fVar223 * auVar80._4_4_;
    auVar200._8_4_ = fVar223 * auVar80._8_4_;
    auVar200._12_4_ = fVar223 * auVar80._12_4_;
    auVar200._16_4_ = fVar223 * auVar80._16_4_;
    auVar200._20_4_ = fVar223 * auVar80._20_4_;
    auVar200._24_4_ = fVar223 * auVar80._24_4_;
    auVar200._28_4_ = 0;
    auVar80 = vmulps_avx512vl(auVar207,auVar82);
    auVar72 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar72));
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_01feed00,ZEXT1632(auVar72));
    auVar127._0_4_ = auVar200._0_4_ + auVar55._0_4_;
    auVar127._4_4_ = auVar200._4_4_ + auVar55._4_4_;
    auVar127._8_4_ = auVar200._8_4_ + auVar55._8_4_;
    auVar127._12_4_ = auVar200._12_4_ + auVar55._12_4_;
    auVar127._16_4_ = auVar200._16_4_ + 0.0;
    auVar127._20_4_ = auVar200._20_4_ + 0.0;
    auVar127._24_4_ = auVar200._24_4_ + 0.0;
    auVar127._28_4_ = 0;
    auVar95 = ZEXT1632(auVar72);
    auVar85 = vpermt2ps_avx512vl(auVar200,_DAT_01feed00,auVar95);
    auVar86 = vaddps_avx512vl(ZEXT1632(auVar53),auVar80);
    auVar87 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar95);
    auVar80 = vsubps_avx(auVar82,auVar85);
    auVar85 = vsubps_avx512vl(auVar84,auVar87);
    auVar87 = vmulps_avx512vl(auVar90,auVar93);
    auVar92 = vmulps_avx512vl(auVar77,auVar93);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar81,auVar88);
    auVar88 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar89);
    auVar89 = vmulps_avx512vl(auVar94,auVar93);
    auVar92 = vmulps_avx512vl(auVar78,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar81,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar77);
    auVar77 = vmulps_avx512vl(auVar91,auVar93);
    auVar79 = vmulps_avx512vl(auVar79,auVar93);
    auVar64 = vfmadd231ps_fma(auVar77,auVar81,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar78);
    auVar79 = vmulps_avx512vl(auVar93,auVar89);
    auVar91 = ZEXT1632(auVar63);
    auVar77 = vmulps_avx512vl(auVar91,auVar90);
    auVar87 = vfmadd231ps_avx512vl(auVar79,auVar81,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar88);
    auVar94 = vmulps_avx512vl(auVar91,auVar94);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar221 * auVar64._12_4_,
                                            CONCAT48(fVar220 * auVar64._8_4_,
                                                     CONCAT44(fVar219 * auVar64._4_4_,
                                                              fVar218 * auVar64._0_4_)))),auVar81,
                         auVar89);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar90);
    auVar28._4_4_ = fVar219 * auVar79._4_4_;
    auVar28._0_4_ = fVar218 * auVar79._0_4_;
    auVar28._8_4_ = fVar220 * auVar79._8_4_;
    auVar28._12_4_ = fVar221 * auVar79._12_4_;
    auVar28._16_4_ = auVar79._16_4_ * 0.0;
    auVar28._20_4_ = auVar79._20_4_ * 0.0;
    auVar28._24_4_ = auVar79._24_4_ * 0.0;
    auVar28._28_4_ = auVar78._28_4_;
    auVar89 = vmulps_avx512vl(auVar91,auVar94);
    auVar90 = vfmadd231ps_avx512vl(auVar28,auVar81,auVar87);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar81);
    auVar81 = vsubps_avx512vl(auVar79,auVar87);
    auVar94 = vsubps_avx512vl(auVar94,auVar88);
    auVar81 = vmulps_avx512vl(auVar81,auVar83);
    auVar94 = vmulps_avx512vl(auVar94,auVar83);
    fVar209 = fVar223 * auVar81._0_4_;
    fVar218 = fVar223 * auVar81._4_4_;
    auVar29._4_4_ = fVar218;
    auVar29._0_4_ = fVar209;
    fVar219 = fVar223 * auVar81._8_4_;
    auVar29._8_4_ = fVar219;
    fVar220 = fVar223 * auVar81._12_4_;
    auVar29._12_4_ = fVar220;
    fVar221 = fVar223 * auVar81._16_4_;
    auVar29._16_4_ = fVar221;
    fVar222 = fVar223 * auVar81._20_4_;
    auVar29._20_4_ = fVar222;
    fVar223 = fVar223 * auVar81._24_4_;
    auVar29._24_4_ = fVar223;
    auVar29._28_4_ = auVar81._28_4_;
    auVar94 = vmulps_avx512vl(auVar207,auVar94);
    auVar83 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,auVar95);
    auVar87 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar95);
    auVar208._0_4_ = auVar90._0_4_ + fVar209;
    auVar208._4_4_ = auVar90._4_4_ + fVar218;
    auVar208._8_4_ = auVar90._8_4_ + fVar219;
    auVar208._12_4_ = auVar90._12_4_ + fVar220;
    auVar208._16_4_ = auVar90._16_4_ + fVar221;
    auVar208._20_4_ = auVar90._20_4_ + fVar222;
    auVar208._24_4_ = auVar90._24_4_ + fVar223;
    auVar208._28_4_ = auVar90._28_4_ + auVar81._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar29,_DAT_01feed00,ZEXT1632(auVar72));
    auVar88 = vaddps_avx512vl(auVar89,auVar94);
    auVar94 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,ZEXT1632(auVar72));
    auVar81 = vsubps_avx(auVar83,auVar81);
    auVar94 = vsubps_avx512vl(auVar87,auVar94);
    auVar140 = ZEXT1632(auVar55);
    auVar79 = vsubps_avx512vl(auVar90,auVar140);
    auVar149 = ZEXT1632(auVar53);
    auVar77 = vsubps_avx512vl(auVar89,auVar149);
    auVar78 = vsubps_avx512vl(auVar83,auVar82);
    auVar79 = vaddps_avx512vl(auVar79,auVar78);
    auVar78 = vsubps_avx512vl(auVar87,auVar84);
    auVar77 = vaddps_avx512vl(auVar77,auVar78);
    auVar78 = vmulps_avx512vl(auVar149,auVar79);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar140,auVar77);
    auVar91 = vmulps_avx512vl(auVar86,auVar79);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar127,auVar77);
    auVar92 = vmulps_avx512vl(auVar85,auVar79);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar80,auVar77);
    auVar93 = vmulps_avx512vl(auVar84,auVar79);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar82,auVar77);
    auVar95 = vmulps_avx512vl(auVar89,auVar79);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar77);
    auVar96 = vmulps_avx512vl(auVar88,auVar79);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar208,auVar77);
    auVar97 = vmulps_avx512vl(auVar94,auVar79);
    auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar81,auVar77);
    auVar79 = vmulps_avx512vl(auVar87,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar83,auVar77);
    auVar77 = vminps_avx512vl(auVar78,auVar91);
    auVar78 = vmaxps_avx512vl(auVar78,auVar91);
    auVar91 = vminps_avx512vl(auVar92,auVar93);
    auVar77 = vminps_avx512vl(auVar77,auVar91);
    auVar91 = vmaxps_avx512vl(auVar92,auVar93);
    auVar78 = vmaxps_avx512vl(auVar78,auVar91);
    auVar91 = vminps_avx512vl(auVar95,auVar96);
    auVar92 = vmaxps_avx512vl(auVar95,auVar96);
    auVar93 = vminps_avx512vl(auVar97,auVar79);
    auVar91 = vminps_avx512vl(auVar91,auVar93);
    auVar77 = vminps_avx512vl(auVar77,auVar91);
    auVar79 = vmaxps_avx512vl(auVar97,auVar79);
    auVar79 = vmaxps_avx512vl(auVar92,auVar79);
    auVar79 = vmaxps_avx512vl(auVar78,auVar79);
    uVar18 = vcmpps_avx512vl(auVar77,local_260,2);
    uVar19 = vcmpps_avx512vl(auVar79,local_280,5);
    bVar36 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar36 == 0) {
      auVar64 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar79 = vsubps_avx512vl(auVar82,auVar140);
      auVar77 = vsubps_avx512vl(auVar84,auVar149);
      auVar78 = vsubps_avx512vl(auVar83,auVar90);
      auVar79 = vaddps_avx512vl(auVar79,auVar78);
      auVar78 = vsubps_avx512vl(auVar87,auVar89);
      auVar77 = vaddps_avx512vl(auVar77,auVar78);
      auVar78 = vmulps_avx512vl(auVar149,auVar79);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar77,auVar140);
      auVar86 = vmulps_avx512vl(auVar86,auVar79);
      auVar86 = vfnmadd213ps_avx512vl(auVar127,auVar77,auVar86);
      auVar85 = vmulps_avx512vl(auVar85,auVar79);
      auVar85 = vfnmadd213ps_avx512vl(auVar80,auVar77,auVar85);
      auVar80 = vmulps_avx512vl(auVar84,auVar79);
      auVar84 = vfnmadd231ps_avx512vl(auVar80,auVar77,auVar82);
      auVar80 = vmulps_avx512vl(auVar89,auVar79);
      auVar89 = vfnmadd231ps_avx512vl(auVar80,auVar77,auVar90);
      auVar80 = vmulps_avx512vl(auVar88,auVar79);
      auVar88 = vfnmadd213ps_avx512vl(auVar208,auVar77,auVar80);
      auVar80 = vmulps_avx512vl(auVar94,auVar79);
      auVar90 = vfnmadd213ps_avx512vl(auVar81,auVar77,auVar80);
      auVar81 = vmulps_avx512vl(auVar87,auVar79);
      auVar87 = vfnmadd231ps_avx512vl(auVar81,auVar83,auVar77);
      auVar80 = vminps_avx(auVar78,auVar86);
      auVar81 = vmaxps_avx(auVar78,auVar86);
      auVar82 = vminps_avx(auVar85,auVar84);
      auVar82 = vminps_avx(auVar80,auVar82);
      auVar80 = vmaxps_avx(auVar85,auVar84);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      auVar94 = vminps_avx(auVar89,auVar88);
      auVar80 = vmaxps_avx(auVar89,auVar88);
      auVar83 = vminps_avx(auVar90,auVar87);
      auVar94 = vminps_avx(auVar94,auVar83);
      auVar94 = vminps_avx(auVar82,auVar94);
      auVar82 = vmaxps_avx(auVar90,auVar87);
      auVar80 = vmaxps_avx(auVar80,auVar82);
      auVar81 = vmaxps_avx(auVar81,auVar80);
      uVar18 = vcmpps_avx512vl(auVar81,local_280,5);
      uVar19 = vcmpps_avx512vl(auVar94,local_260,2);
      bVar36 = bVar36 & (byte)uVar18 & (byte)uVar19;
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      if (bVar36 != 0) {
        auStack_430[uVar38] = (uint)bVar36;
        uVar18 = vmovlps_avx(auVar50);
        (&uStack_240)[uVar38] = uVar18;
        uVar3 = vmovlps_avx(auVar70);
        auStack_1a0[uVar38] = uVar3;
        uVar38 = (ulong)((int)uVar38 + 1);
      }
      auVar64 = vxorps_avx512vl(auVar79._0_16_,auVar79._0_16_);
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar262 = ZEXT1664(auVar63);
    auVar258 = ZEXT3264(_DAT_01feed20);
    auVar257 = ZEXT1664(auVar72);
    auVar256 = ZEXT1664(auVar50);
    auVar255 = ZEXT3264(auVar81);
    auVar254 = ZEXT1664(auVar64);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar261 = ZEXT1664(auVar50);
LAB_01e2355d:
    do {
      do {
        do {
          auVar63 = auVar254._0_16_;
          if ((int)uVar38 == 0) {
            uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar23._4_4_ = uVar112;
            auVar23._0_4_ = uVar112;
            auVar23._8_4_ = uVar112;
            auVar23._12_4_ = uVar112;
            auVar23._16_4_ = uVar112;
            auVar23._20_4_ = uVar112;
            auVar23._24_4_ = uVar112;
            auVar23._28_4_ = uVar112;
            uVar18 = vcmpps_avx512vl(local_1c0,auVar23,2);
            uVar45 = (uint)uVar44 & (uint)uVar44 + 0xff & (uint)uVar18;
            uVar44 = (ulong)uVar45;
            if (uVar45 == 0) {
              return;
            }
            goto LAB_01e224bb;
          }
          uVar37 = (int)uVar38 - 1;
          uVar39 = (ulong)uVar37;
          uVar8 = auStack_430[uVar39];
          auVar70._8_8_ = 0;
          auVar70._0_8_ = auStack_1a0[uVar39];
          uVar3 = 0;
          for (uVar43 = (ulong)uVar8; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
          {
            uVar3 = uVar3 + 1;
          }
          uVar41 = uVar8 - 1 & uVar8;
          bVar48 = uVar41 == 0;
          auStack_430[uVar39] = uVar41;
          if (bVar48) {
            uVar38 = (ulong)uVar37;
          }
          auVar114._8_8_ = 0;
          auVar114._0_8_ = uVar3;
          auVar50 = vpunpcklqdq_avx(auVar114,ZEXT416((int)uVar3 + 1));
          auVar50 = vcvtqq2ps_avx512vl(auVar50);
          auVar50 = vmulps_avx512vl(auVar50,auVar256._0_16_);
          uVar112 = *(undefined4 *)((long)&uStack_240 + uVar39 * 8 + 4);
          auVar20._4_4_ = uVar112;
          auVar20._0_4_ = uVar112;
          auVar20._8_4_ = uVar112;
          auVar20._12_4_ = uVar112;
          auVar64 = vmulps_avx512vl(auVar50,auVar20);
          auVar72 = auVar257._0_16_;
          auVar50 = vsubps_avx512vl(auVar72,auVar50);
          uVar112 = *(undefined4 *)(&uStack_240 + uVar39);
          auVar21._4_4_ = uVar112;
          auVar21._0_4_ = uVar112;
          auVar21._8_4_ = uVar112;
          auVar21._12_4_ = uVar112;
          auVar50 = vfmadd231ps_avx512vl(auVar64,auVar50,auVar21);
          auVar64 = vmovshdup_avx(auVar50);
          fVar223 = auVar64._0_4_ - auVar50._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar223));
          if (uVar8 == 0 || bVar48) goto LAB_01e23009;
          auVar64 = vshufps_avx(auVar70,auVar70,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar223));
          auVar55 = vsubps_avx512vl(auVar72,auVar64);
          fVar209 = auVar64._0_4_;
          auVar144._0_4_ = fVar209 * fVar118;
          fVar218 = auVar64._4_4_;
          auVar144._4_4_ = fVar218 * fVar119;
          fVar219 = auVar64._8_4_;
          auVar144._8_4_ = fVar219 * fVar118;
          fVar220 = auVar64._12_4_;
          auVar144._12_4_ = fVar220 * fVar119;
          auVar157._0_4_ = fVar209 * fVar120;
          auVar157._4_4_ = fVar218 * fVar128;
          auVar157._8_4_ = fVar219 * fVar120;
          auVar157._12_4_ = fVar220 * fVar128;
          auVar167._0_4_ = fVar209 * fVar153;
          auVar167._4_4_ = fVar218 * fVar163;
          auVar167._8_4_ = fVar219 * fVar153;
          auVar167._12_4_ = fVar220 * fVar163;
          auVar130._0_4_ = fVar209 * fVar164;
          auVar130._4_4_ = fVar218 * fVar172;
          auVar130._8_4_ = fVar219 * fVar164;
          auVar130._12_4_ = fVar220 * fVar172;
          auVar64 = vfmadd231ps_fma(auVar144,auVar55,auVar51);
          auVar73 = vfmadd231ps_fma(auVar157,auVar55,auVar62);
          auVar52 = vfmadd231ps_fma(auVar167,auVar55,auVar65);
          auVar53 = vfmadd231ps_avx512vl(auVar130,auVar67,auVar55);
          auVar141._16_16_ = auVar64;
          auVar141._0_16_ = auVar64;
          auVar150._16_16_ = auVar73;
          auVar150._0_16_ = auVar73;
          auVar162._16_16_ = auVar52;
          auVar162._0_16_ = auVar52;
          auVar80 = vpermps_avx512vl(auVar258._0_32_,ZEXT1632(auVar50));
          auVar81 = vsubps_avx(auVar150,auVar141);
          auVar73 = vfmadd213ps_fma(auVar81,auVar80,auVar141);
          auVar81 = vsubps_avx(auVar162,auVar150);
          auVar55 = vfmadd213ps_fma(auVar81,auVar80,auVar150);
          auVar64 = vsubps_avx(auVar53,auVar52);
          auVar151._16_16_ = auVar64;
          auVar151._0_16_ = auVar64;
          auVar64 = vfmadd213ps_fma(auVar151,auVar80,auVar162);
          auVar81 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar73));
          auVar73 = vfmadd213ps_fma(auVar81,auVar80,ZEXT1632(auVar73));
          auVar81 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar55));
          auVar64 = vfmadd213ps_fma(auVar81,auVar80,ZEXT1632(auVar55));
          auVar81 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar73));
          auVar61 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar81,auVar80);
          auVar81 = vmulps_avx512vl(auVar81,auVar255._0_32_);
          auVar99._16_16_ = auVar81._16_16_;
          auVar64 = vmulss_avx512f(ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar209 = auVar64._0_4_;
          auVar168._0_8_ =
               CONCAT44(auVar61._4_4_ + fVar209 * auVar81._4_4_,
                        auVar61._0_4_ + fVar209 * auVar81._0_4_);
          auVar168._8_4_ = auVar61._8_4_ + fVar209 * auVar81._8_4_;
          auVar168._12_4_ = auVar61._12_4_ + fVar209 * auVar81._12_4_;
          auVar145._0_4_ = fVar209 * auVar81._16_4_;
          auVar145._4_4_ = fVar209 * auVar81._20_4_;
          auVar145._8_4_ = fVar209 * auVar81._24_4_;
          auVar145._12_4_ = fVar209 * auVar81._28_4_;
          auVar58 = vsubps_avx((undefined1  [16])0x0,auVar145);
          auVar53 = vshufpd_avx(auVar61,auVar61,3);
          auVar54 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar64 = vsubps_avx(auVar53,auVar61);
          auVar73 = vsubps_avx(auVar54,(undefined1  [16])0x0);
          auVar193._0_4_ = auVar64._0_4_ + auVar73._0_4_;
          auVar193._4_4_ = auVar64._4_4_ + auVar73._4_4_;
          auVar193._8_4_ = auVar64._8_4_ + auVar73._8_4_;
          auVar193._12_4_ = auVar64._12_4_ + auVar73._12_4_;
          auVar64 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar73 = vshufps_avx(auVar168,auVar168,0xb1);
          auVar52 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar242._4_4_ = auVar193._0_4_;
          auVar242._0_4_ = auVar193._0_4_;
          auVar242._8_4_ = auVar193._0_4_;
          auVar242._12_4_ = auVar193._0_4_;
          auVar56 = vshufps_avx(auVar193,auVar193,0x55);
          fVar209 = auVar56._0_4_;
          auVar204._0_4_ = auVar64._0_4_ * fVar209;
          fVar218 = auVar56._4_4_;
          auVar204._4_4_ = auVar64._4_4_ * fVar218;
          fVar219 = auVar56._8_4_;
          auVar204._8_4_ = auVar64._8_4_ * fVar219;
          fVar220 = auVar56._12_4_;
          auVar204._12_4_ = auVar64._12_4_ * fVar220;
          auVar211._0_4_ = auVar73._0_4_ * fVar209;
          auVar211._4_4_ = auVar73._4_4_ * fVar218;
          auVar211._8_4_ = auVar73._8_4_ * fVar219;
          auVar211._12_4_ = auVar73._12_4_ * fVar220;
          auVar226._0_4_ = auVar52._0_4_ * fVar209;
          auVar226._4_4_ = auVar52._4_4_ * fVar218;
          auVar226._8_4_ = auVar52._8_4_ * fVar219;
          auVar226._12_4_ = auVar52._12_4_ * fVar220;
          auVar194._0_4_ = auVar55._0_4_ * fVar209;
          auVar194._4_4_ = auVar55._4_4_ * fVar218;
          auVar194._8_4_ = auVar55._8_4_ * fVar219;
          auVar194._12_4_ = auVar55._12_4_ * fVar220;
          auVar64 = vfmadd231ps_fma(auVar204,auVar242,auVar61);
          auVar73 = vfmadd231ps_fma(auVar211,auVar242,auVar168);
          auVar59 = vfmadd231ps_fma(auVar226,auVar242,auVar58);
          auVar60 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar242);
          auVar56 = vshufpd_avx(auVar64,auVar64,1);
          auVar57 = vshufpd_avx(auVar73,auVar73,1);
          auVar68 = vshufpd_avx512vl(auVar59,auVar59,1);
          auVar74 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar52 = vminss_avx(auVar64,auVar73);
          auVar64 = vmaxss_avx(auVar73,auVar64);
          auVar55 = vminss_avx(auVar59,auVar60);
          auVar73 = vmaxss_avx(auVar60,auVar59);
          auVar52 = vminss_avx(auVar52,auVar55);
          auVar64 = vmaxss_avx(auVar73,auVar64);
          auVar55 = vminss_avx(auVar56,auVar57);
          auVar73 = vmaxss_avx(auVar57,auVar56);
          auVar56 = vminss_avx512f(auVar68,auVar74);
          auVar57 = vmaxss_avx512f(auVar74,auVar68);
          auVar73 = vmaxss_avx(auVar57,auVar73);
          auVar55 = vminss_avx512f(auVar55,auVar56);
          fVar218 = auVar73._0_4_;
          fVar209 = auVar64._0_4_;
          if (auVar52._0_4_ < 0.0001) {
            bVar49 = fVar218 == -0.0001;
            bVar46 = NAN(fVar218);
            if (fVar218 <= -0.0001) goto LAB_01e2378b;
            break;
          }
LAB_01e2378b:
          vucomiss_avx512f(auVar55);
          bVar49 = fVar218 <= -0.0001;
          bVar47 = -0.0001 < fVar209;
          bVar46 = bVar49;
          if (!bVar49) break;
          uVar18 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar19 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
          bVar36 = (byte)uVar18 & (byte)uVar19 & 1;
          bVar49 = bVar47 && bVar36 == 0;
          bVar46 = bVar47 && bVar36 == 0;
        } while (!bVar47 || bVar36 != 0);
        vcmpss_avx512f(auVar52,auVar63,1);
        auVar59 = auVar259._0_16_;
        uVar18 = vcmpss_avx512f(auVar64,auVar63,1);
        bVar47 = (bool)((byte)uVar18 & 1);
        auVar99._0_16_ = auVar59;
        iVar110 = auVar259._0_4_;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * iVar110);
        vucomiss_avx512f(auVar98._0_16_);
        bVar46 = (bool)(!bVar49 | bVar46);
        bVar47 = bVar46 == false;
        auVar101._16_16_ = auVar99._16_16_;
        auVar101._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar46 * auVar254._0_4_ + (uint)!bVar46 * 0x7f800000;
        auVar57 = auVar100._0_16_;
        auVar103._16_16_ = auVar99._16_16_;
        auVar103._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar46 * auVar254._0_4_ + (uint)!bVar46 * -0x800000;
        auVar56 = auVar102._0_16_;
        uVar18 = vcmpss_avx512f(auVar55,auVar63,1);
        bVar49 = (bool)((byte)uVar18 & 1);
        auVar105._16_16_ = auVar99._16_16_;
        auVar105._0_16_ = auVar59;
        auVar104._4_28_ = auVar105._4_28_;
        auVar104._0_4_ = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * iVar110);
        vucomiss_avx512f(auVar104._0_16_);
        if ((bVar46) || (bVar47)) {
          auVar55 = vucomiss_avx512f(auVar52);
          if ((bVar46) || (bVar47)) {
            auVar60 = vxorps_avx512vl(auVar52,auVar261._0_16_);
            auVar52 = vsubss_avx512f(auVar55,auVar52);
            auVar52 = vdivss_avx512f(auVar60,auVar52);
            auVar55 = vsubss_avx512f(auVar59,auVar52);
            auVar52 = vfmadd213ss_avx512f(auVar55,auVar63,auVar52);
            auVar55 = auVar52;
          }
          else {
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            vucomiss_avx512f(auVar55);
            if ((bVar46) || (auVar52 = auVar59, bVar47)) {
              auVar52 = SUB6416(ZEXT464(0xff800000),0);
              auVar55 = ZEXT416(0x7f800000);
            }
          }
          auVar57 = vminss_avx512f(auVar57,auVar55);
          auVar56 = vmaxss_avx(auVar52,auVar56);
        }
        uVar18 = vcmpss_avx512f(auVar73,auVar63,1);
        bVar49 = (bool)((byte)uVar18 & 1);
        fVar219 = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * iVar110);
        if ((auVar98._0_4_ != fVar219) || (NAN(auVar98._0_4_) || NAN(fVar219))) {
          if ((fVar218 != fVar209) || (NAN(fVar218) || NAN(fVar209))) {
            auVar64 = vxorps_avx512vl(auVar64,auVar261._0_16_);
            auVar195._0_4_ = auVar64._0_4_ / (fVar218 - fVar209);
            auVar195._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar59,auVar195);
            auVar64 = vfmadd213ss_avx512f(auVar64,auVar63,auVar195);
            auVar73 = auVar64;
          }
          else if ((fVar209 != 0.0) ||
                  (auVar64 = auVar59, auVar73 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar209))) {
            auVar64 = SUB6416(ZEXT464(0xff800000),0);
            auVar73 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar57 = vminss_avx(auVar57,auVar73);
          auVar56 = vmaxss_avx(auVar64,auVar56);
        }
        bVar49 = auVar104._0_4_ != fVar219;
        auVar64 = vminss_avx512f(auVar57,auVar59);
        auVar107._16_16_ = auVar99._16_16_;
        auVar107._0_16_ = auVar57;
        auVar106._4_28_ = auVar107._4_28_;
        auVar106._0_4_ = (uint)bVar49 * auVar64._0_4_ + (uint)!bVar49 * auVar57._0_4_;
        auVar64 = vmaxss_avx512f(auVar59,auVar56);
        auVar109._16_16_ = auVar99._16_16_;
        auVar109._0_16_ = auVar56;
        auVar108._4_28_ = auVar109._4_28_;
        auVar108._0_4_ = (uint)bVar49 * auVar64._0_4_ + (uint)!bVar49 * auVar56._0_4_;
        auVar64 = vmaxss_avx512f(auVar63,auVar106._0_16_);
        auVar73 = vminss_avx512f(auVar108._0_16_,auVar59);
      } while (auVar73._0_4_ < auVar64._0_4_);
      auVar57 = vmaxss_avx512f(auVar63,ZEXT416((uint)(auVar64._0_4_ + -0.1)));
      auVar60 = vminss_avx512f(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar59);
      auVar131._0_8_ = auVar61._0_8_;
      auVar131._8_8_ = auVar131._0_8_;
      auVar212._8_8_ = auVar168._0_8_;
      auVar212._0_8_ = auVar168._0_8_;
      auVar227._8_8_ = auVar58._0_8_;
      auVar227._0_8_ = auVar58._0_8_;
      auVar64 = vshufpd_avx(auVar168,auVar168,3);
      auVar73 = vshufpd_avx(auVar58,auVar58,3);
      auVar52 = vshufps_avx(auVar57,auVar60,0);
      auVar56 = vsubps_avx512vl(auVar72,auVar52);
      fVar209 = auVar52._0_4_;
      auVar158._0_4_ = fVar209 * auVar53._0_4_;
      fVar218 = auVar52._4_4_;
      auVar158._4_4_ = fVar218 * auVar53._4_4_;
      fVar219 = auVar52._8_4_;
      auVar158._8_4_ = fVar219 * auVar53._8_4_;
      fVar220 = auVar52._12_4_;
      auVar158._12_4_ = fVar220 * auVar53._12_4_;
      auVar169._0_4_ = fVar209 * auVar64._0_4_;
      auVar169._4_4_ = fVar218 * auVar64._4_4_;
      auVar169._8_4_ = fVar219 * auVar64._8_4_;
      auVar169._12_4_ = fVar220 * auVar64._12_4_;
      auVar248._0_4_ = auVar73._0_4_ * fVar209;
      auVar248._4_4_ = auVar73._4_4_ * fVar218;
      auVar248._8_4_ = auVar73._8_4_ * fVar219;
      auVar248._12_4_ = auVar73._12_4_ * fVar220;
      auVar146._0_4_ = fVar209 * auVar54._0_4_;
      auVar146._4_4_ = fVar218 * auVar54._4_4_;
      auVar146._8_4_ = fVar219 * auVar54._8_4_;
      auVar146._12_4_ = fVar220 * auVar54._12_4_;
      auVar55 = vfmadd231ps_fma(auVar158,auVar56,auVar131);
      auVar53 = vfmadd231ps_fma(auVar169,auVar56,auVar212);
      auVar54 = vfmadd231ps_fma(auVar248,auVar56,auVar227);
      auVar56 = vfmadd231ps_fma(auVar146,auVar56,ZEXT816(0));
      auVar73 = vsubss_avx512f(auVar59,auVar57);
      auVar64 = vmovshdup_avx(auVar70);
      auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar57._0_4_)),auVar70,auVar73);
      auVar73 = vsubss_avx512f(auVar59,auVar60);
      auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar60._0_4_)),auVar70,auVar73);
      auVar57 = vdivss_avx512f(auVar59,ZEXT416((uint)fVar223));
      auVar64 = vsubps_avx(auVar53,auVar55);
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar73 = vmulps_avx512vl(auVar64,auVar58);
      auVar64 = vsubps_avx(auVar54,auVar53);
      auVar52 = vmulps_avx512vl(auVar64,auVar58);
      auVar64 = vsubps_avx(auVar56,auVar54);
      auVar64 = vmulps_avx512vl(auVar64,auVar58);
      auVar70 = vminps_avx(auVar52,auVar64);
      auVar64 = vmaxps_avx(auVar52,auVar64);
      auVar70 = vminps_avx(auVar73,auVar70);
      auVar64 = vmaxps_avx(auVar73,auVar64);
      auVar73 = vshufpd_avx(auVar70,auVar70,3);
      auVar52 = vshufpd_avx(auVar64,auVar64,3);
      auVar70 = vminps_avx(auVar70,auVar73);
      auVar64 = vmaxps_avx(auVar64,auVar52);
      fVar223 = auVar57._0_4_;
      auVar196._0_4_ = auVar70._0_4_ * fVar223;
      auVar196._4_4_ = auVar70._4_4_ * fVar223;
      auVar196._8_4_ = auVar70._8_4_ * fVar223;
      auVar196._12_4_ = auVar70._12_4_ * fVar223;
      auVar181._0_4_ = fVar223 * auVar64._0_4_;
      auVar181._4_4_ = fVar223 * auVar64._4_4_;
      auVar181._8_4_ = fVar223 * auVar64._8_4_;
      auVar181._12_4_ = fVar223 * auVar64._12_4_;
      auVar57 = vdivss_avx512f(auVar59,ZEXT416((uint)(auVar68._0_4_ - auVar61._0_4_)));
      auVar64 = vshufpd_avx(auVar55,auVar55,3);
      auVar70 = vshufpd_avx(auVar53,auVar53,3);
      auVar73 = vshufpd_avx(auVar54,auVar54,3);
      auVar52 = vshufpd_avx(auVar56,auVar56,3);
      auVar64 = vsubps_avx(auVar64,auVar55);
      auVar55 = vsubps_avx(auVar70,auVar53);
      auVar53 = vsubps_avx(auVar73,auVar54);
      auVar52 = vsubps_avx(auVar52,auVar56);
      auVar70 = vminps_avx(auVar64,auVar55);
      auVar64 = vmaxps_avx(auVar64,auVar55);
      auVar73 = vminps_avx(auVar53,auVar52);
      auVar73 = vminps_avx(auVar70,auVar73);
      auVar70 = vmaxps_avx(auVar53,auVar52);
      auVar64 = vmaxps_avx(auVar64,auVar70);
      fVar223 = auVar57._0_4_;
      auVar228._0_4_ = fVar223 * auVar73._0_4_;
      auVar228._4_4_ = fVar223 * auVar73._4_4_;
      auVar228._8_4_ = fVar223 * auVar73._8_4_;
      auVar228._12_4_ = fVar223 * auVar73._12_4_;
      auVar213._0_4_ = fVar223 * auVar64._0_4_;
      auVar213._4_4_ = fVar223 * auVar64._4_4_;
      auVar213._8_4_ = fVar223 * auVar64._8_4_;
      auVar213._12_4_ = fVar223 * auVar64._12_4_;
      auVar52 = vinsertps_avx(auVar50,auVar61,0x10);
      auVar74 = vpermt2ps_avx512vl(auVar50,_DAT_01feecd0,auVar68);
      auVar122._0_4_ = auVar52._0_4_ + auVar74._0_4_;
      auVar122._4_4_ = auVar52._4_4_ + auVar74._4_4_;
      auVar122._8_4_ = auVar52._8_4_ + auVar74._8_4_;
      auVar122._12_4_ = auVar52._12_4_ + auVar74._12_4_;
      auVar57 = vmulps_avx512vl(auVar122,auVar262._0_16_);
      auVar70 = vshufps_avx(auVar57,auVar57,0x54);
      uVar112 = auVar57._0_4_;
      auVar124._4_4_ = uVar112;
      auVar124._0_4_ = uVar112;
      auVar124._8_4_ = uVar112;
      auVar124._12_4_ = uVar112;
      auVar53 = vfmadd213ps_avx512vl(local_2a0,auVar124,auVar66);
      auVar73 = vfmadd213ps_fma(local_2b0,auVar124,local_440);
      auVar55 = vfmadd213ps_fma(local_2c0,auVar124,local_450);
      auVar64 = vsubps_avx(auVar73,auVar53);
      auVar53 = vfmadd213ps_fma(auVar64,auVar124,auVar53);
      auVar64 = vsubps_avx(auVar55,auVar73);
      auVar64 = vfmadd213ps_fma(auVar64,auVar124,auVar73);
      auVar64 = vsubps_avx(auVar64,auVar53);
      auVar73 = vfmadd231ps_fma(auVar53,auVar64,auVar124);
      auVar54 = vmulps_avx512vl(auVar64,auVar58);
      auVar237._8_8_ = auVar73._0_8_;
      auVar237._0_8_ = auVar73._0_8_;
      auVar64 = vshufpd_avx(auVar73,auVar73,3);
      auVar73 = vshufps_avx(auVar57,auVar57,0x55);
      auVar55 = vsubps_avx(auVar64,auVar237);
      auVar53 = vfmadd231ps_fma(auVar237,auVar73,auVar55);
      auVar249._8_8_ = auVar54._0_8_;
      auVar249._0_8_ = auVar54._0_8_;
      auVar64 = vshufpd_avx(auVar54,auVar54,3);
      auVar64 = vsubps_avx512vl(auVar64,auVar249);
      auVar64 = vfmadd213ps_avx512vl(auVar64,auVar73,auVar249);
      auVar125._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar55._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar55._12_4_ ^ 0x80000000;
      auVar73 = vmovshdup_avx512vl(auVar64);
      auVar250._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar250._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar250._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar54 = vmovshdup_avx512vl(auVar55);
      auVar56 = vpermt2ps_avx512vl(auVar250,ZEXT416(5),auVar55);
      auVar73 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar73._0_4_ * auVar55._0_4_)),auVar64,auVar54);
      auVar55 = vpermt2ps_avx512vl(auVar64,SUB6416(ZEXT464(4),0),auVar125);
      auVar147._0_4_ = auVar73._0_4_;
      auVar147._4_4_ = auVar147._0_4_;
      auVar147._8_4_ = auVar147._0_4_;
      auVar147._12_4_ = auVar147._0_4_;
      auVar64 = vdivps_avx(auVar56,auVar147);
      auVar75 = vdivps_avx512vl(auVar55,auVar147);
      fVar223 = auVar53._0_4_;
      auVar73 = vshufps_avx(auVar53,auVar53,0x55);
      auVar238._0_4_ = fVar223 * auVar64._0_4_ + auVar73._0_4_ * auVar75._0_4_;
      auVar238._4_4_ = fVar223 * auVar64._4_4_ + auVar73._4_4_ * auVar75._4_4_;
      auVar238._8_4_ = fVar223 * auVar64._8_4_ + auVar73._8_4_ * auVar75._8_4_;
      auVar238._12_4_ = fVar223 * auVar64._12_4_ + auVar73._12_4_ * auVar75._12_4_;
      auVar58 = vsubps_avx(auVar70,auVar238);
      auVar73 = vmovshdup_avx(auVar64);
      auVar70 = vinsertps_avx(auVar196,auVar228,0x1c);
      auVar251._0_4_ = auVar73._0_4_ * auVar70._0_4_;
      auVar251._4_4_ = auVar73._4_4_ * auVar70._4_4_;
      auVar251._8_4_ = auVar73._8_4_ * auVar70._8_4_;
      auVar251._12_4_ = auVar73._12_4_ * auVar70._12_4_;
      auVar60 = vinsertps_avx512f(auVar181,auVar213,0x1c);
      auVar73 = vmulps_avx512vl(auVar73,auVar60);
      auVar56 = vminps_avx512vl(auVar251,auVar73);
      auVar53 = vmaxps_avx(auVar73,auVar251);
      auVar54 = vmovshdup_avx(auVar75);
      auVar73 = vinsertps_avx(auVar228,auVar196,0x4c);
      auVar229._0_4_ = auVar54._0_4_ * auVar73._0_4_;
      auVar229._4_4_ = auVar54._4_4_ * auVar73._4_4_;
      auVar229._8_4_ = auVar54._8_4_ * auVar73._8_4_;
      auVar229._12_4_ = auVar54._12_4_ * auVar73._12_4_;
      auVar55 = vinsertps_avx(auVar213,auVar181,0x4c);
      auVar214._0_4_ = auVar54._0_4_ * auVar55._0_4_;
      auVar214._4_4_ = auVar54._4_4_ * auVar55._4_4_;
      auVar214._8_4_ = auVar54._8_4_ * auVar55._8_4_;
      auVar214._12_4_ = auVar54._12_4_ * auVar55._12_4_;
      auVar54 = vminps_avx(auVar229,auVar214);
      auVar56 = vaddps_avx512vl(auVar56,auVar54);
      auVar54 = vmaxps_avx(auVar214,auVar229);
      auVar215._0_4_ = auVar53._0_4_ + auVar54._0_4_;
      auVar215._4_4_ = auVar53._4_4_ + auVar54._4_4_;
      auVar215._8_4_ = auVar53._8_4_ + auVar54._8_4_;
      auVar215._12_4_ = auVar53._12_4_ + auVar54._12_4_;
      auVar230._8_8_ = 0x3f80000000000000;
      auVar230._0_8_ = 0x3f80000000000000;
      auVar53 = vsubps_avx(auVar230,auVar215);
      auVar54 = vsubps_avx(auVar230,auVar56);
      auVar56 = vsubps_avx(auVar52,auVar57);
      auVar57 = vsubps_avx(auVar74,auVar57);
      fVar220 = auVar56._0_4_;
      auVar252._0_4_ = fVar220 * auVar53._0_4_;
      fVar221 = auVar56._4_4_;
      auVar252._4_4_ = fVar221 * auVar53._4_4_;
      fVar222 = auVar56._8_4_;
      auVar252._8_4_ = fVar222 * auVar53._8_4_;
      fVar173 = auVar56._12_4_;
      auVar252._12_4_ = fVar173 * auVar53._12_4_;
      auVar76 = vbroadcastss_avx512vl(auVar64);
      auVar70 = vmulps_avx512vl(auVar76,auVar70);
      auVar60 = vmulps_avx512vl(auVar76,auVar60);
      auVar76 = vminps_avx512vl(auVar70,auVar60);
      auVar60 = vmaxps_avx512vl(auVar60,auVar70);
      auVar70 = vbroadcastss_avx512vl(auVar75);
      auVar73 = vmulps_avx512vl(auVar70,auVar73);
      auVar70 = vmulps_avx512vl(auVar70,auVar55);
      auVar55 = vminps_avx512vl(auVar73,auVar70);
      auVar55 = vaddps_avx512vl(auVar76,auVar55);
      auVar56 = vmulps_avx512vl(auVar56,auVar54);
      fVar223 = auVar57._0_4_;
      auVar216._0_4_ = fVar223 * auVar53._0_4_;
      fVar209 = auVar57._4_4_;
      auVar216._4_4_ = fVar209 * auVar53._4_4_;
      fVar218 = auVar57._8_4_;
      auVar216._8_4_ = fVar218 * auVar53._8_4_;
      fVar219 = auVar57._12_4_;
      auVar216._12_4_ = fVar219 * auVar53._12_4_;
      auVar231._0_4_ = fVar223 * auVar54._0_4_;
      auVar231._4_4_ = fVar209 * auVar54._4_4_;
      auVar231._8_4_ = fVar218 * auVar54._8_4_;
      auVar231._12_4_ = fVar219 * auVar54._12_4_;
      auVar70 = vmaxps_avx(auVar70,auVar73);
      auVar182._0_4_ = auVar60._0_4_ + auVar70._0_4_;
      auVar182._4_4_ = auVar60._4_4_ + auVar70._4_4_;
      auVar182._8_4_ = auVar60._8_4_ + auVar70._8_4_;
      auVar182._12_4_ = auVar60._12_4_ + auVar70._12_4_;
      auVar197._8_8_ = 0x3f800000;
      auVar197._0_8_ = 0x3f800000;
      auVar70 = vsubps_avx(auVar197,auVar182);
      auVar73 = vsubps_avx512vl(auVar197,auVar55);
      auVar243._0_4_ = fVar220 * auVar70._0_4_;
      auVar243._4_4_ = fVar221 * auVar70._4_4_;
      auVar243._8_4_ = fVar222 * auVar70._8_4_;
      auVar243._12_4_ = fVar173 * auVar70._12_4_;
      auVar239._0_4_ = fVar220 * auVar73._0_4_;
      auVar239._4_4_ = fVar221 * auVar73._4_4_;
      auVar239._8_4_ = fVar222 * auVar73._8_4_;
      auVar239._12_4_ = fVar173 * auVar73._12_4_;
      auVar183._0_4_ = fVar223 * auVar70._0_4_;
      auVar183._4_4_ = fVar209 * auVar70._4_4_;
      auVar183._8_4_ = fVar218 * auVar70._8_4_;
      auVar183._12_4_ = fVar219 * auVar70._12_4_;
      auVar198._0_4_ = fVar223 * auVar73._0_4_;
      auVar198._4_4_ = fVar209 * auVar73._4_4_;
      auVar198._8_4_ = fVar218 * auVar73._8_4_;
      auVar198._12_4_ = fVar219 * auVar73._12_4_;
      auVar70 = vminps_avx(auVar243,auVar239);
      auVar73 = vminps_avx512vl(auVar183,auVar198);
      auVar55 = vminps_avx512vl(auVar70,auVar73);
      auVar70 = vmaxps_avx(auVar239,auVar243);
      auVar73 = vmaxps_avx(auVar198,auVar183);
      auVar73 = vmaxps_avx(auVar73,auVar70);
      auVar53 = vminps_avx512vl(auVar252,auVar56);
      auVar70 = vminps_avx(auVar216,auVar231);
      auVar70 = vminps_avx(auVar53,auVar70);
      auVar70 = vhaddps_avx(auVar55,auVar70);
      auVar53 = vmaxps_avx512vl(auVar56,auVar252);
      auVar55 = vmaxps_avx(auVar231,auVar216);
      auVar55 = vmaxps_avx(auVar55,auVar53);
      auVar73 = vhaddps_avx(auVar73,auVar55);
      auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
      auVar73 = vshufps_avx(auVar73,auVar73,0xe8);
      auVar184._0_4_ = auVar70._0_4_ + auVar58._0_4_;
      auVar184._4_4_ = auVar70._4_4_ + auVar58._4_4_;
      auVar184._8_4_ = auVar70._8_4_ + auVar58._8_4_;
      auVar184._12_4_ = auVar70._12_4_ + auVar58._12_4_;
      auVar199._0_4_ = auVar73._0_4_ + auVar58._0_4_;
      auVar199._4_4_ = auVar73._4_4_ + auVar58._4_4_;
      auVar199._8_4_ = auVar73._8_4_ + auVar58._8_4_;
      auVar199._12_4_ = auVar73._12_4_ + auVar58._12_4_;
      auVar70 = vmaxps_avx(auVar52,auVar184);
      auVar73 = vminps_avx(auVar199,auVar74);
      uVar3 = vcmpps_avx512vl(auVar73,auVar70,1);
    } while ((uVar3 & 3) != 0);
    uVar3 = vcmpps_avx512vl(auVar199,auVar74,1);
    uVar18 = vcmpps_avx512vl(auVar50,auVar184,1);
    if (((ushort)uVar18 & (ushort)uVar3 & 1) == 0) {
      bVar36 = 0;
    }
    else {
      auVar70 = vmovshdup_avx(auVar184);
      bVar36 = auVar61._0_4_ < auVar70._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar38 || uVar8 != 0 && !bVar48) | bVar36) == 1) {
      lVar40 = 200;
      do {
        auVar50 = vsubss_avx512f(auVar59,auVar58);
        fVar218 = auVar50._0_4_;
        fVar223 = fVar218 * fVar218 * fVar218;
        auVar50 = vmulss_avx512f(auVar58,ZEXT416(0x40400000));
        fVar209 = auVar50._0_4_ * fVar218 * fVar218;
        fVar219 = auVar58._0_4_;
        auVar50 = vmulss_avx512f(ZEXT416((uint)(fVar219 * fVar219)),ZEXT416(0x40400000));
        fVar218 = fVar218 * auVar50._0_4_;
        auVar138._4_4_ = fVar223;
        auVar138._0_4_ = fVar223;
        auVar138._8_4_ = fVar223;
        auVar138._12_4_ = fVar223;
        auVar132._4_4_ = fVar209;
        auVar132._0_4_ = fVar209;
        auVar132._8_4_ = fVar209;
        auVar132._12_4_ = fVar209;
        auVar115._4_4_ = fVar218;
        auVar115._0_4_ = fVar218;
        auVar115._8_4_ = fVar218;
        auVar115._12_4_ = fVar218;
        fVar219 = fVar219 * fVar219 * fVar219;
        auVar159._0_4_ = (float)local_290._0_4_ * fVar219;
        auVar159._4_4_ = (float)local_290._4_4_ * fVar219;
        auVar159._8_4_ = fStack_288 * fVar219;
        auVar159._12_4_ = fStack_284 * fVar219;
        auVar50 = vfmadd231ps_fma(auVar159,local_450,auVar115);
        auVar50 = vfmadd231ps_fma(auVar50,local_440,auVar132);
        auVar50 = vfmadd231ps_fma(auVar50,auVar66,auVar138);
        auVar116._8_8_ = auVar50._0_8_;
        auVar116._0_8_ = auVar50._0_8_;
        auVar50 = vshufpd_avx(auVar50,auVar50,3);
        auVar70 = vshufps_avx(auVar58,auVar58,0x55);
        auVar50 = vsubps_avx(auVar50,auVar116);
        auVar70 = vfmadd213ps_fma(auVar50,auVar70,auVar116);
        fVar223 = auVar70._0_4_;
        auVar50 = vshufps_avx(auVar70,auVar70,0x55);
        auVar117._0_4_ = auVar64._0_4_ * fVar223 + auVar75._0_4_ * auVar50._0_4_;
        auVar117._4_4_ = auVar64._4_4_ * fVar223 + auVar75._4_4_ * auVar50._4_4_;
        auVar117._8_4_ = auVar64._8_4_ * fVar223 + auVar75._8_4_ * auVar50._8_4_;
        auVar117._12_4_ = auVar64._12_4_ * fVar223 + auVar75._12_4_ * auVar50._12_4_;
        auVar58 = vsubps_avx(auVar58,auVar117);
        auVar50 = vandps_avx512vl(auVar70,auVar260._0_16_);
        auVar70 = vprolq_avx512vl(auVar50,0x20);
        auVar50 = vmaxss_avx(auVar70,auVar50);
        bVar48 = fVar111 < auVar50._0_4_;
        if (auVar50._0_4_ < fVar111) {
          auVar50 = vucomiss_avx512f(auVar63);
          if (bVar48) break;
          auVar64 = vucomiss_avx512f(auVar50);
          auVar259 = ZEXT1664(auVar64);
          if (bVar48) break;
          vmovshdup_avx(auVar50);
          auVar64 = vucomiss_avx512f(auVar63);
          if (bVar48) break;
          auVar70 = vucomiss_avx512f(auVar64);
          auVar259 = ZEXT1664(auVar70);
          if (bVar48) break;
          auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar58 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
          auVar73 = vdpps_avx(auVar58,local_2d0,0x7f);
          auVar52 = vdpps_avx(auVar58,local_2e0,0x7f);
          auVar55 = vdpps_avx(auVar58,local_2f0,0x7f);
          auVar53 = vdpps_avx(auVar58,local_300,0x7f);
          auVar54 = vdpps_avx(auVar58,local_310,0x7f);
          auVar56 = vdpps_avx(auVar58,local_320,0x7f);
          auVar57 = vdpps_avx(auVar58,local_330,0x7f);
          auVar58 = vdpps_avx(auVar58,local_340,0x7f);
          auVar59 = vsubss_avx512f(auVar70,auVar64);
          fVar219 = auVar64._0_4_;
          auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar54._0_4_)),auVar59,auVar73);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar219)),auVar59,auVar52);
          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar219)),auVar59,auVar55);
          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar58._0_4_)),auVar59,auVar53);
          auVar70 = vsubss_avx512f(auVar70,auVar50);
          auVar170._0_4_ = auVar70._0_4_;
          fVar223 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
          auVar70 = vmulss_avx512f(auVar50,ZEXT416(0x40400000));
          fVar209 = auVar70._0_4_ * auVar170._0_4_ * auVar170._0_4_;
          local_120 = auVar50._0_4_;
          auVar160._0_4_ = local_120 * local_120;
          auVar160._4_4_ = auVar50._4_4_ * auVar50._4_4_;
          auVar160._8_4_ = auVar50._8_4_ * auVar50._8_4_;
          auVar160._12_4_ = auVar50._12_4_ * auVar50._12_4_;
          auVar70 = vmulss_avx512f(auVar160,ZEXT416(0x40400000));
          fVar218 = auVar170._0_4_ * auVar70._0_4_;
          fVar221 = local_120 * auVar160._0_4_;
          auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * auVar55._0_4_)),ZEXT416((uint)fVar218),
                                    auVar52);
          auVar70 = vfmadd231ss_fma(auVar70,ZEXT416((uint)fVar209),auVar73);
          auVar64 = vfmadd231ss_fma(auVar70,ZEXT416((uint)fVar223),auVar64);
          fVar220 = auVar64._0_4_;
          if ((fVar220 < fVar129) || (fVar222 = *(float *)(ray + k * 4 + 0x100), fVar222 < fVar220))
          break;
          auVar64 = vshufps_avx(auVar50,auVar50,0x55);
          auVar73 = vsubps_avx512vl(auVar72,auVar64);
          fVar173 = auVar64._0_4_;
          auVar205._0_4_ = fVar173 * (float)local_390._0_4_;
          fVar190 = auVar64._4_4_;
          auVar205._4_4_ = fVar190 * (float)local_390._4_4_;
          fVar191 = auVar64._8_4_;
          auVar205._8_4_ = fVar191 * fStack_388;
          fVar192 = auVar64._12_4_;
          auVar205._12_4_ = fVar192 * fStack_384;
          auVar217._0_4_ = fVar173 * (float)local_3a0._0_4_;
          auVar217._4_4_ = fVar190 * (float)local_3a0._4_4_;
          auVar217._8_4_ = fVar191 * fStack_398;
          auVar217._12_4_ = fVar192 * fStack_394;
          auVar232._0_4_ = fVar173 * (float)local_3b0._0_4_;
          auVar232._4_4_ = fVar190 * (float)local_3b0._4_4_;
          auVar232._8_4_ = fVar191 * fStack_3a8;
          auVar232._12_4_ = fVar192 * fStack_3a4;
          auVar185._0_4_ = fVar173 * (float)local_3c0._0_4_;
          auVar185._4_4_ = fVar190 * (float)local_3c0._4_4_;
          auVar185._8_4_ = fVar191 * fStack_3b8;
          auVar185._12_4_ = fVar192 * fStack_3b4;
          auVar64 = vfmadd231ps_fma(auVar205,auVar73,local_350);
          auVar70 = vfmadd231ps_fma(auVar217,auVar73,local_360);
          auVar72 = vfmadd231ps_fma(auVar232,auVar73,local_370);
          auVar73 = vfmadd231ps_fma(auVar185,auVar73,local_380);
          auVar64 = vsubps_avx(auVar70,auVar64);
          auVar70 = vsubps_avx(auVar72,auVar70);
          auVar72 = vsubps_avx(auVar73,auVar72);
          auVar233._0_4_ = local_120 * auVar70._0_4_;
          auVar233._4_4_ = local_120 * auVar70._4_4_;
          auVar233._8_4_ = local_120 * auVar70._8_4_;
          auVar233._12_4_ = local_120 * auVar70._12_4_;
          auVar170._4_4_ = auVar170._0_4_;
          auVar170._8_4_ = auVar170._0_4_;
          auVar170._12_4_ = auVar170._0_4_;
          auVar64 = vfmadd231ps_fma(auVar233,auVar170,auVar64);
          auVar186._0_4_ = local_120 * auVar72._0_4_;
          auVar186._4_4_ = local_120 * auVar72._4_4_;
          auVar186._8_4_ = local_120 * auVar72._8_4_;
          auVar186._12_4_ = local_120 * auVar72._12_4_;
          auVar70 = vfmadd231ps_fma(auVar186,auVar170,auVar70);
          auVar187._0_4_ = local_120 * auVar70._0_4_;
          auVar187._4_4_ = local_120 * auVar70._4_4_;
          auVar187._8_4_ = local_120 * auVar70._8_4_;
          auVar187._12_4_ = local_120 * auVar70._12_4_;
          auVar64 = vfmadd231ps_fma(auVar187,auVar170,auVar64);
          auVar22._8_4_ = 0x40400000;
          auVar22._0_8_ = 0x4040000040400000;
          auVar22._12_4_ = 0x40400000;
          auVar64 = vmulps_avx512vl(auVar64,auVar22);
          pGVar9 = (context->scene->geometries).items[uVar45].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
          auVar161._0_4_ = fVar221 * (float)local_400._0_4_;
          auVar161._4_4_ = fVar221 * (float)local_400._4_4_;
          auVar161._8_4_ = fVar221 * fStack_3f8;
          auVar161._12_4_ = fVar221 * fStack_3f4;
          auVar148._4_4_ = fVar218;
          auVar148._0_4_ = fVar218;
          auVar148._8_4_ = fVar218;
          auVar148._12_4_ = fVar218;
          auVar70 = vfmadd132ps_fma(auVar148,auVar161,local_3f0);
          auVar139._4_4_ = fVar209;
          auVar139._0_4_ = fVar209;
          auVar139._8_4_ = fVar209;
          auVar139._12_4_ = fVar209;
          auVar70 = vfmadd132ps_fma(auVar139,auVar70,local_3e0);
          auVar133._4_4_ = fVar223;
          auVar133._0_4_ = fVar223;
          auVar133._8_4_ = fVar223;
          auVar133._12_4_ = fVar223;
          auVar73 = vfmadd132ps_fma(auVar133,auVar70,local_3d0);
          auVar70 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar72 = vshufps_avx(auVar64,auVar64,0xc9);
          auVar134._0_4_ = auVar73._0_4_ * auVar72._0_4_;
          auVar134._4_4_ = auVar73._4_4_ * auVar72._4_4_;
          auVar134._8_4_ = auVar73._8_4_ * auVar72._8_4_;
          auVar134._12_4_ = auVar73._12_4_ * auVar72._12_4_;
          auVar64 = vfmsub231ps_fma(auVar134,auVar64,auVar70);
          local_140 = auVar64._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar220;
            uVar112 = vextractps_avx(auVar64,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar112;
            uVar112 = vextractps_avx(auVar64,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar112;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar219;
            *(uint *)(ray + k * 4 + 0x220) = uVar7;
            *(uint *)(ray + k * 4 + 0x240) = uVar45;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            break;
          }
          auVar142._8_4_ = 1;
          auVar142._0_8_ = 0x100000001;
          auVar142._12_4_ = 1;
          auVar142._16_4_ = 1;
          auVar142._20_4_ = 1;
          auVar142._24_4_ = 1;
          auVar142._28_4_ = 1;
          local_100 = vpermps_avx2(auVar142,ZEXT1632(auVar50));
          auVar81 = vpermps_avx2(auVar142,ZEXT1632(auVar64));
          auVar152._8_4_ = 2;
          auVar152._0_8_ = 0x200000002;
          auVar152._12_4_ = 2;
          auVar152._16_4_ = 2;
          auVar152._20_4_ = 2;
          auVar152._24_4_ = 2;
          auVar152._28_4_ = 2;
          local_160 = vpermps_avx2(auVar152,ZEXT1632(auVar64));
          local_180[0] = (RTCHitN)auVar81[0];
          local_180[1] = (RTCHitN)auVar81[1];
          local_180[2] = (RTCHitN)auVar81[2];
          local_180[3] = (RTCHitN)auVar81[3];
          local_180[4] = (RTCHitN)auVar81[4];
          local_180[5] = (RTCHitN)auVar81[5];
          local_180[6] = (RTCHitN)auVar81[6];
          local_180[7] = (RTCHitN)auVar81[7];
          local_180[8] = (RTCHitN)auVar81[8];
          local_180[9] = (RTCHitN)auVar81[9];
          local_180[10] = (RTCHitN)auVar81[10];
          local_180[0xb] = (RTCHitN)auVar81[0xb];
          local_180[0xc] = (RTCHitN)auVar81[0xc];
          local_180[0xd] = (RTCHitN)auVar81[0xd];
          local_180[0xe] = (RTCHitN)auVar81[0xe];
          local_180[0xf] = (RTCHitN)auVar81[0xf];
          local_180[0x10] = (RTCHitN)auVar81[0x10];
          local_180[0x11] = (RTCHitN)auVar81[0x11];
          local_180[0x12] = (RTCHitN)auVar81[0x12];
          local_180[0x13] = (RTCHitN)auVar81[0x13];
          local_180[0x14] = (RTCHitN)auVar81[0x14];
          local_180[0x15] = (RTCHitN)auVar81[0x15];
          local_180[0x16] = (RTCHitN)auVar81[0x16];
          local_180[0x17] = (RTCHitN)auVar81[0x17];
          local_180[0x18] = (RTCHitN)auVar81[0x18];
          local_180[0x19] = (RTCHitN)auVar81[0x19];
          local_180[0x1a] = (RTCHitN)auVar81[0x1a];
          local_180[0x1b] = (RTCHitN)auVar81[0x1b];
          local_180[0x1c] = (RTCHitN)auVar81[0x1c];
          local_180[0x1d] = (RTCHitN)auVar81[0x1d];
          local_180[0x1e] = (RTCHitN)auVar81[0x1e];
          local_180[0x1f] = (RTCHitN)auVar81[0x1f];
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          local_e0 = local_200._0_8_;
          uStack_d8 = local_200._8_8_;
          uStack_d0 = local_200._16_8_;
          uStack_c8 = local_200._24_8_;
          local_c0 = local_1e0;
          vpcmpeqd_avx2(local_1e0,local_1e0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar220;
          local_420 = local_220;
          local_480.valid = (int *)local_420;
          local_480.geometryUserPtr = pGVar9->userPtr;
          local_480.context = context->user;
          local_480.hit = local_180;
          local_480.N = 8;
          local_480.ray = (RTCRayN *)ray;
          if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar9->intersectionFilterN)(&local_480);
            auVar258 = ZEXT3264(_DAT_01feed20);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar257 = ZEXT1664(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
            auVar256 = ZEXT1664(auVar50);
            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
            auVar255 = ZEXT3264(auVar81);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar261 = ZEXT1664(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar260 = ZEXT1664(auVar50);
            auVar259 = ZEXT464(0x3f800000);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar262 = ZEXT1664(auVar50);
            auVar50 = vxorps_avx512vl(auVar63,auVar63);
            auVar254 = ZEXT1664(auVar50);
          }
          auVar50 = auVar254._0_16_;
          if (local_420 != (undefined1  [32])0x0) {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_480);
              auVar258 = ZEXT3264(_DAT_01feed20);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar257 = ZEXT1664(auVar63);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
              auVar256 = ZEXT1664(auVar63);
              auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
              auVar255 = ZEXT3264(auVar81);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar261 = ZEXT1664(auVar63);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar260 = ZEXT1664(auVar63);
              auVar259 = ZEXT464(0x3f800000);
              auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
              auVar262 = ZEXT1664(auVar63);
              auVar50 = vxorps_avx512vl(auVar50,auVar50);
              auVar254 = ZEXT1664(auVar50);
            }
            if (local_420 != (undefined1  [32])0x0) {
              uVar3 = vptestmd_avx512vl(local_420,local_420);
              iVar110 = *(int *)(local_480.hit + 4);
              iVar30 = *(int *)(local_480.hit + 8);
              iVar31 = *(int *)(local_480.hit + 0xc);
              iVar32 = *(int *)(local_480.hit + 0x10);
              iVar33 = *(int *)(local_480.hit + 0x14);
              iVar34 = *(int *)(local_480.hit + 0x18);
              iVar35 = *(int *)(local_480.hit + 0x1c);
              bVar36 = (byte)uVar3;
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar17 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_480.ray + 0x180) =
                   (uint)(bVar36 & 1) * *(int *)local_480.hit |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_480.ray + 0x180);
              *(uint *)(local_480.ray + 0x184) =
                   (uint)bVar48 * iVar110 | (uint)!bVar48 * *(int *)(local_480.ray + 0x184);
              *(uint *)(local_480.ray + 0x188) =
                   (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_480.ray + 0x188);
              *(uint *)(local_480.ray + 0x18c) =
                   (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_480.ray + 0x18c);
              *(uint *)(local_480.ray + 400) =
                   (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_480.ray + 400);
              *(uint *)(local_480.ray + 0x194) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_480.ray + 0x194);
              *(uint *)(local_480.ray + 0x198) =
                   (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_480.ray + 0x198);
              *(uint *)(local_480.ray + 0x19c) =
                   (uint)bVar17 * iVar35 | (uint)!bVar17 * *(int *)(local_480.ray + 0x19c);
              iVar110 = *(int *)(local_480.hit + 0x24);
              iVar30 = *(int *)(local_480.hit + 0x28);
              iVar31 = *(int *)(local_480.hit + 0x2c);
              iVar32 = *(int *)(local_480.hit + 0x30);
              iVar33 = *(int *)(local_480.hit + 0x34);
              iVar34 = *(int *)(local_480.hit + 0x38);
              iVar35 = *(int *)(local_480.hit + 0x3c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar17 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_480.ray + 0x1a0) =
                   (uint)(bVar36 & 1) * *(int *)(local_480.hit + 0x20) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_480.ray + 0x1a0);
              *(uint *)(local_480.ray + 0x1a4) =
                   (uint)bVar48 * iVar110 | (uint)!bVar48 * *(int *)(local_480.ray + 0x1a4);
              *(uint *)(local_480.ray + 0x1a8) =
                   (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_480.ray + 0x1a8);
              *(uint *)(local_480.ray + 0x1ac) =
                   (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1ac);
              *(uint *)(local_480.ray + 0x1b0) =
                   (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1b0);
              *(uint *)(local_480.ray + 0x1b4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1b4);
              *(uint *)(local_480.ray + 0x1b8) =
                   (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1b8);
              *(uint *)(local_480.ray + 0x1bc) =
                   (uint)bVar17 * iVar35 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1bc);
              iVar110 = *(int *)(local_480.hit + 0x44);
              iVar30 = *(int *)(local_480.hit + 0x48);
              iVar31 = *(int *)(local_480.hit + 0x4c);
              iVar32 = *(int *)(local_480.hit + 0x50);
              iVar33 = *(int *)(local_480.hit + 0x54);
              iVar34 = *(int *)(local_480.hit + 0x58);
              iVar35 = *(int *)(local_480.hit + 0x5c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar17 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_480.ray + 0x1c0) =
                   (uint)(bVar36 & 1) * *(int *)(local_480.hit + 0x40) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_480.ray + 0x1c0);
              *(uint *)(local_480.ray + 0x1c4) =
                   (uint)bVar48 * iVar110 | (uint)!bVar48 * *(int *)(local_480.ray + 0x1c4);
              *(uint *)(local_480.ray + 0x1c8) =
                   (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_480.ray + 0x1c8);
              *(uint *)(local_480.ray + 0x1cc) =
                   (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1cc);
              *(uint *)(local_480.ray + 0x1d0) =
                   (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1d0);
              *(uint *)(local_480.ray + 0x1d4) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_480.ray + 0x1d4);
              *(uint *)(local_480.ray + 0x1d8) =
                   (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1d8);
              *(uint *)(local_480.ray + 0x1dc) =
                   (uint)bVar17 * iVar35 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1dc);
              iVar110 = *(int *)(local_480.hit + 100);
              iVar30 = *(int *)(local_480.hit + 0x68);
              iVar31 = *(int *)(local_480.hit + 0x6c);
              iVar32 = *(int *)(local_480.hit + 0x70);
              iVar33 = *(int *)(local_480.hit + 0x74);
              iVar34 = *(int *)(local_480.hit + 0x78);
              iVar35 = *(int *)(local_480.hit + 0x7c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar17 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_480.ray + 0x1e0) =
                   (uint)(bVar36 & 1) * *(int *)(local_480.hit + 0x60) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_480.ray + 0x1e0);
              *(uint *)(local_480.ray + 0x1e4) =
                   (uint)bVar48 * iVar110 | (uint)!bVar48 * *(int *)(local_480.ray + 0x1e4);
              *(uint *)(local_480.ray + 0x1e8) =
                   (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_480.ray + 0x1e8);
              *(uint *)(local_480.ray + 0x1ec) =
                   (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_480.ray + 0x1ec);
              *(uint *)(local_480.ray + 0x1f0) =
                   (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_480.ray + 0x1f0);
              *(uint *)(local_480.ray + 500) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_480.ray + 500);
              *(uint *)(local_480.ray + 0x1f8) =
                   (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_480.ray + 0x1f8);
              *(uint *)(local_480.ray + 0x1fc) =
                   (uint)bVar17 * iVar35 | (uint)!bVar17 * *(int *)(local_480.ray + 0x1fc);
              iVar110 = *(int *)(local_480.hit + 0x84);
              iVar30 = *(int *)(local_480.hit + 0x88);
              iVar31 = *(int *)(local_480.hit + 0x8c);
              iVar32 = *(int *)(local_480.hit + 0x90);
              iVar33 = *(int *)(local_480.hit + 0x94);
              iVar34 = *(int *)(local_480.hit + 0x98);
              iVar35 = *(int *)(local_480.hit + 0x9c);
              bVar48 = (bool)((byte)(uVar3 >> 1) & 1);
              bVar49 = (bool)((byte)(uVar3 >> 2) & 1);
              bVar46 = (bool)((byte)(uVar3 >> 3) & 1);
              bVar47 = (bool)((byte)(uVar3 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar3 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar3 >> 6) & 1);
              bVar17 = SUB81(uVar3 >> 7,0);
              *(uint *)(local_480.ray + 0x200) =
                   (uint)(bVar36 & 1) * *(int *)(local_480.hit + 0x80) |
                   (uint)!(bool)(bVar36 & 1) * *(int *)(local_480.ray + 0x200);
              *(uint *)(local_480.ray + 0x204) =
                   (uint)bVar48 * iVar110 | (uint)!bVar48 * *(int *)(local_480.ray + 0x204);
              *(uint *)(local_480.ray + 0x208) =
                   (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_480.ray + 0x208);
              *(uint *)(local_480.ray + 0x20c) =
                   (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_480.ray + 0x20c);
              *(uint *)(local_480.ray + 0x210) =
                   (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_480.ray + 0x210);
              *(uint *)(local_480.ray + 0x214) =
                   (uint)bVar15 * iVar33 | (uint)!bVar15 * *(int *)(local_480.ray + 0x214);
              *(uint *)(local_480.ray + 0x218) =
                   (uint)bVar16 * iVar34 | (uint)!bVar16 * *(int *)(local_480.ray + 0x218);
              *(uint *)(local_480.ray + 0x21c) =
                   (uint)bVar17 * iVar35 | (uint)!bVar17 * *(int *)(local_480.ray + 0x21c);
              auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xa0));
              *(undefined1 (*) [32])(local_480.ray + 0x220) = auVar81;
              auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xc0));
              *(undefined1 (*) [32])(local_480.ray + 0x240) = auVar81;
              auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0xe0));
              *(undefined1 (*) [32])(local_480.ray + 0x260) = auVar81;
              auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_480.hit + 0x100));
              *(undefined1 (*) [32])(local_480.ray + 0x280) = auVar81;
              break;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar222;
          break;
        }
        lVar40 = lVar40 + -1;
      } while (lVar40 != 0);
      goto LAB_01e2355d;
    }
    auVar70 = vinsertps_avx(auVar61,auVar68,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }